

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void idct64x64_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int *piVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  longlong lVar43;
  longlong lVar44;
  longlong lVar45;
  longlong lVar46;
  longlong lVar47;
  longlong lVar48;
  longlong lVar49;
  int iVar50;
  uint *puVar51;
  long lVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  undefined8 *puVar63;
  ulong uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar95;
  uint uVar102;
  uint uVar103;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  int iVar104;
  uint uVar105;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  int iVar108;
  uint uVar109;
  int iVar117;
  int iVar119;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  uint uVar118;
  uint uVar120;
  int iVar121;
  uint uVar122;
  undefined1 auVar116 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  __m128i rnding;
  __m128i clamp_lo_out;
  int local_648;
  int iStack_644;
  int iStack_640;
  int iStack_63c;
  int local_638;
  int iStack_634;
  int iStack_630;
  int iStack_62c;
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  int local_5a8;
  int iStack_5a4;
  int iStack_5a0;
  int iStack_59c;
  int local_598;
  int iStack_594;
  int iStack_590;
  int iStack_58c;
  undefined8 uStack_520;
  undefined8 uStack_510;
  undefined8 uStack_4c0;
  undefined8 uStack_4b0;
  int local_448;
  int iStack_444;
  int iStack_440;
  int iStack_43c;
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  uint local_428 [16];
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_348;
  int iStack_344;
  int iStack_340;
  int iStack_33c;
  undefined1 local_338 [16];
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [16];
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 local_218 [16];
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  undefined1 local_1c8 [16];
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  undefined1 local_198 [16];
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  undefined1 local_148 [16];
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  uint local_128 [7];
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  
  lVar52 = (long)bit;
  auVar143 = ZEXT416((uint)bit);
  lVar53 = lVar52 * 0x100;
  iVar57 = 1 << ((char)bit - 1U & 0x1f);
  iVar58 = bd + (uint)(do_cols == 0) * 2;
  iVar50 = 0x8000;
  if (0xf < iVar58 + 6) {
    iVar50 = 1 << ((char)iVar58 + 5U & 0x1f);
  }
  uVar2 = *(undefined4 *)((long)&DAT_004ded40 + lVar53 + 4);
  auVar80._4_4_ = uVar2;
  auVar80._0_4_ = uVar2;
  auVar80._8_4_ = uVar2;
  auVar80._12_4_ = uVar2;
  uVar2 = *(undefined4 *)(&DAT_004ded48 + lVar52 * 0x20);
  auVar115._4_4_ = uVar2;
  auVar115._0_4_ = uVar2;
  auVar115._8_4_ = uVar2;
  auVar115._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&DAT_004ded48 + lVar53 + 4);
  auVar134._4_4_ = uVar2;
  auVar134._0_4_ = uVar2;
  auVar134._8_4_ = uVar2;
  auVar134._12_4_ = uVar2;
  iVar58 = *(int *)(&DAT_004ded50 + lVar52 * 0x20);
  uVar2 = *(undefined4 *)(&DAT_004ded58 + lVar52 * 0x20);
  auVar81._4_4_ = uVar2;
  auVar81._0_4_ = uVar2;
  auVar81._8_4_ = uVar2;
  auVar81._12_4_ = uVar2;
  uVar2 = *(undefined4 *)(&DAT_004dee3c + lVar53);
  auVar112._4_4_ = uVar2;
  auVar112._0_4_ = uVar2;
  auVar112._8_4_ = uVar2;
  auVar112._12_4_ = uVar2;
  iVar59 = -*(int *)(&DAT_004dee24 + lVar53);
  auVar137._4_4_ = iVar59;
  auVar137._0_4_ = iVar59;
  auVar137._8_4_ = iVar59;
  auVar137._12_4_ = iVar59;
  uVar2 = *(undefined4 *)((long)&DAT_004ded58 + lVar53 + 4);
  auVar142._4_4_ = uVar2;
  auVar142._0_4_ = uVar2;
  auVar142._8_4_ = uVar2;
  auVar142._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&DAT_004ded50 + lVar53 + 4);
  auVar139._4_4_ = uVar2;
  auVar139._0_4_ = uVar2;
  auVar139._8_4_ = uVar2;
  auVar139._12_4_ = uVar2;
  uVar2 = *(undefined4 *)(&DAT_004dee2c + lVar53);
  auVar88._4_4_ = uVar2;
  auVar88._0_4_ = uVar2;
  auVar88._8_4_ = uVar2;
  auVar88._12_4_ = uVar2;
  iVar59 = -*(int *)(&DAT_004dee34 + lVar53);
  auVar140._4_4_ = iVar59;
  auVar140._0_4_ = iVar59;
  auVar140._8_4_ = iVar59;
  auVar140._12_4_ = iVar59;
  iVar59 = -*(int *)(&DAT_004dee28 + lVar53);
  auVar146._4_4_ = iVar59;
  auVar146._0_4_ = iVar59;
  auVar146._8_4_ = iVar59;
  auVar146._12_4_ = iVar59;
  uVar2 = *(undefined4 *)(&DAT_004dee38 + lVar53);
  auVar70._4_4_ = uVar2;
  auVar70._0_4_ = uVar2;
  auVar70._8_4_ = uVar2;
  auVar70._12_4_ = uVar2;
  auVar65 = pmulld(auVar80,(undefined1  [16])in[1]);
  auVar106 = pmulld(auVar112,(undefined1  [16])in[1]);
  auVar132 = pmulld(auVar137,(undefined1  [16])in[7]);
  auVar135 = pmulld(auVar142,(undefined1  [16])in[7]);
  auVar96 = pmulld(auVar139,(undefined1  [16])in[5]);
  auVar86 = pmulld(auVar88,(undefined1  [16])in[5]);
  auVar123 = pmulld(auVar140,(undefined1  [16])in[3]);
  auVar126 = pmulld(auVar134,(undefined1  [16])in[3]);
  auVar110 = pmulld(auVar115,(undefined1  [16])in[2]);
  auVar69 = pmulld(auVar70,(undefined1  [16])in[2]);
  auVar139 = pmulld(auVar146,(undefined1  [16])in[6]);
  auVar80 = pmulld(auVar81,(undefined1  [16])in[6]);
  uVar2 = *(undefined4 *)(&DAT_004dee30 + lVar53);
  auVar83._4_4_ = uVar2;
  auVar83._0_4_ = uVar2;
  auVar83._8_4_ = uVar2;
  auVar83._12_4_ = uVar2;
  iVar59 = -iVar58;
  auVar138._0_8_ = CONCAT44(auVar65._4_4_ + iVar57 >> auVar143,auVar65._0_4_ + iVar57 >> auVar143);
  auVar138._8_4_ = auVar65._8_4_ + iVar57 >> auVar143;
  auVar138._12_4_ = auVar65._12_4_ + iVar57 >> auVar143;
  auVar82._4_4_ = iVar59;
  auVar82._0_4_ = iVar59;
  auVar82._8_4_ = iVar59;
  auVar82._12_4_ = iVar59;
  auVar107._0_8_ = CONCAT44(auVar106._4_4_ + iVar57 >> auVar143,auVar106._0_4_ + iVar57 >> auVar143)
  ;
  auVar107._8_4_ = auVar106._8_4_ + iVar57 >> auVar143;
  auVar107._12_4_ = auVar106._12_4_ + iVar57 >> auVar143;
  auVar81 = pmulld(auVar82,auVar107);
  auVar140 = pmulld(auVar138,auVar83);
  auVar141._4_4_ = iVar58;
  auVar141._0_4_ = iVar58;
  auVar141._8_4_ = iVar58;
  auVar141._12_4_ = iVar58;
  auVar70 = pmulld(auVar141,(undefined1  [16])in[4]);
  auVar82 = pmulld((undefined1  [16])in[4],auVar83);
  auVar76 = pmulld(auVar83,auVar107);
  auVar142 = pmulld(auVar141,auVar138);
  iVar58 = *(int *)(&DAT_004dedb0 + lVar53);
  auVar106._4_4_ = iVar58;
  auVar106._0_4_ = iVar58;
  auVar106._8_4_ = iVar58;
  auVar106._12_4_ = iVar58;
  iVar59 = -*(int *)(&DAT_004dedd0 + lVar53);
  auVar133._0_4_ = auVar132._0_4_ + iVar57 >> auVar143;
  auVar133._4_4_ = auVar132._4_4_ + iVar57 >> auVar143;
  auVar133._8_4_ = auVar132._8_4_ + iVar57 >> auVar143;
  auVar133._12_4_ = auVar132._12_4_ + iVar57 >> auVar143;
  auVar79._4_4_ = iVar59;
  auVar79._0_4_ = iVar59;
  auVar79._8_4_ = iVar59;
  auVar79._12_4_ = iVar59;
  auVar136._0_4_ = auVar135._0_4_ + iVar57 >> auVar143;
  auVar136._4_4_ = auVar135._4_4_ + iVar57 >> auVar143;
  auVar136._8_4_ = auVar135._8_4_ + iVar57 >> auVar143;
  auVar136._12_4_ = auVar135._12_4_ + iVar57 >> auVar143;
  auVar77 = pmulld(auVar133,auVar79);
  auVar65 = pmulld(auVar106,auVar136);
  iVar58 = -iVar58;
  auVar84._4_4_ = iVar58;
  auVar84._0_4_ = iVar58;
  auVar84._8_4_ = iVar58;
  auVar84._12_4_ = iVar58;
  auVar78 = pmulld(auVar84,auVar133);
  auVar106 = pmulld(auVar79,auVar136);
  iVar58 = *(int *)(&DAT_004ded90 + lVar53);
  uVar2 = *(undefined4 *)(&DAT_004dedf0 + lVar53);
  auVar85._4_4_ = uVar2;
  auVar85._0_4_ = uVar2;
  auVar85._8_4_ = uVar2;
  auVar85._12_4_ = uVar2;
  iVar59 = -iVar58;
  auVar97._0_4_ = auVar96._0_4_ + iVar57 >> auVar143;
  auVar97._4_4_ = auVar96._4_4_ + iVar57 >> auVar143;
  auVar97._8_4_ = auVar96._8_4_ + iVar57 >> auVar143;
  auVar97._12_4_ = auVar96._12_4_ + iVar57 >> auVar143;
  auVar87._0_4_ = auVar86._0_4_ + iVar57 >> auVar143;
  auVar87._4_4_ = auVar86._4_4_ + iVar57 >> auVar143;
  auVar87._8_4_ = auVar86._8_4_ + iVar57 >> auVar143;
  auVar87._12_4_ = auVar86._12_4_ + iVar57 >> auVar143;
  auVar91._4_4_ = iVar59;
  auVar91._0_4_ = iVar59;
  auVar91._8_4_ = iVar59;
  auVar91._12_4_ = iVar59;
  auVar88 = pmulld(auVar91,auVar87);
  auVar137 = pmulld(auVar97,auVar85);
  auVar89._4_4_ = iVar58;
  auVar89._0_4_ = iVar58;
  auVar89._8_4_ = iVar58;
  auVar89._12_4_ = iVar58;
  auVar79 = pmulld(auVar85,auVar87);
  auVar83 = pmulld(auVar89,auVar97);
  iVar58 = *(int *)(&DAT_004ded70 + lVar52 * 0x20);
  iVar59 = -iVar58;
  auVar90._4_4_ = iVar59;
  auVar90._0_4_ = iVar59;
  auVar90._8_4_ = iVar59;
  auVar90._12_4_ = iVar59;
  iVar59 = -*(int *)(&DAT_004dee10 + lVar53);
  auVar92._4_4_ = iVar59;
  auVar92._0_4_ = iVar59;
  auVar92._8_4_ = iVar59;
  auVar92._12_4_ = iVar59;
  auVar124._0_4_ = auVar123._0_4_ + iVar57 >> auVar143;
  auVar124._4_4_ = auVar123._4_4_ + iVar57 >> auVar143;
  auVar124._8_4_ = auVar123._8_4_ + iVar57 >> auVar143;
  auVar124._12_4_ = auVar123._12_4_ + iVar57 >> auVar143;
  auVar127._0_4_ = auVar126._0_4_ + iVar57 >> auVar143;
  auVar127._4_4_ = auVar126._4_4_ + iVar57 >> auVar143;
  auVar127._8_4_ = auVar126._8_4_ + iVar57 >> auVar143;
  auVar127._12_4_ = auVar126._12_4_ + iVar57 >> auVar143;
  auVar84 = pmulld(auVar90,auVar124);
  auVar134 = pmulld(auVar127,auVar92);
  auVar125._4_4_ = iVar58;
  auVar125._0_4_ = iVar58;
  auVar125._8_4_ = iVar58;
  auVar125._12_4_ = iVar58;
  auVar89 = pmulld(auVar92,auVar124);
  auVar125 = pmulld(auVar125,auVar127);
  iVar58 = *(int *)(&DAT_004ded60 + lVar52 * 0x20);
  iVar59 = *(int *)(&DAT_004dee20 + lVar53);
  auVar98._4_4_ = iVar59;
  auVar98._0_4_ = iVar59;
  auVar98._8_4_ = iVar59;
  auVar98._12_4_ = iVar59;
  iVar60 = -iVar58;
  auVar96._4_4_ = iVar60;
  auVar96._0_4_ = iVar60;
  auVar96._8_4_ = iVar60;
  auVar96._12_4_ = iVar60;
  auVar111._0_8_ = CONCAT44(auVar110._4_4_ + iVar57 >> auVar143,auVar110._0_4_ + iVar57 >> auVar143)
  ;
  auVar111._8_4_ = auVar110._8_4_ + iVar57 >> auVar143;
  auVar111._12_4_ = auVar110._12_4_ + iVar57 >> auVar143;
  auVar126._0_8_ = CONCAT44(auVar69._4_4_ + iVar57 >> auVar143,auVar69._0_4_ + iVar57 >> auVar143);
  auVar126._8_4_ = auVar69._8_4_ + iVar57 >> auVar143;
  auVar126._12_4_ = auVar69._12_4_ + iVar57 >> auVar143;
  auVar90 = pmulld(auVar126,auVar96);
  auVar85 = pmulld(auVar111,auVar98);
  auVar110._4_4_ = iVar58;
  auVar110._0_4_ = iVar58;
  auVar110._8_4_ = iVar58;
  auVar110._12_4_ = iVar58;
  auVar86 = pmulld(auVar126,auVar98);
  auVar112 = pmulld(auVar111,auVar110);
  iVar58 = *(int *)(&DAT_004deda0 + lVar53);
  iVar60 = *(int *)(&DAT_004dede0 + lVar53);
  iVar61 = -iVar58;
  auVar132._4_4_ = iVar61;
  auVar132._0_4_ = iVar61;
  auVar132._8_4_ = iVar61;
  auVar132._12_4_ = iVar61;
  iVar61 = -iVar60;
  local_638 = auVar139._0_4_;
  iStack_634 = auVar139._4_4_;
  iStack_630 = auVar139._8_4_;
  iStack_62c = auVar139._12_4_;
  auVar144._0_4_ = local_638 + iVar57 >> auVar143;
  auVar144._4_4_ = iStack_634 + iVar57 >> auVar143;
  auVar144._8_4_ = iStack_630 + iVar57 >> auVar143;
  auVar144._12_4_ = iStack_62c + iVar57 >> auVar143;
  auVar123._4_4_ = iVar61;
  auVar123._0_4_ = iVar61;
  auVar123._8_4_ = iVar61;
  auVar123._12_4_ = iVar61;
  local_648 = auVar80._0_4_;
  iStack_644 = auVar80._4_4_;
  iStack_640 = auVar80._8_4_;
  iStack_63c = auVar80._12_4_;
  auVar113._0_4_ = local_648 + iVar57 >> auVar143;
  auVar113._4_4_ = iStack_644 + iVar57 >> auVar143;
  auVar113._8_4_ = iStack_640 + iVar57 >> auVar143;
  auVar113._12_4_ = iStack_63c + iVar57 >> auVar143;
  auVar114 = pmulld(auVar144,auVar132);
  auVar80 = pmulld(auVar113,auVar123);
  auVar135._4_4_ = iVar58;
  auVar135._0_4_ = iVar58;
  auVar135._8_4_ = iVar58;
  auVar135._12_4_ = iVar58;
  auVar91 = pmulld(auVar144,auVar123);
  auVar69 = pmulld(auVar113,auVar135);
  iVar58 = *(int *)(&DAT_004ded80 + lVar53);
  iVar61 = *(int *)(&DAT_004dee00 + lVar53);
  auVar128._4_4_ = iVar61;
  auVar128._0_4_ = iVar61;
  auVar128._8_4_ = iVar61;
  auVar128._12_4_ = iVar61;
  iVar62 = -iVar58;
  auVar145._4_4_ = iVar62;
  auVar145._0_4_ = iVar62;
  auVar145._8_4_ = iVar62;
  auVar145._12_4_ = iVar62;
  local_598 = auVar70._0_4_;
  iStack_594 = auVar70._4_4_;
  iStack_590 = auVar70._8_4_;
  iStack_58c = auVar70._12_4_;
  local_338._0_4_ = local_598 + iVar57 >> auVar143;
  local_338._4_4_ = iStack_594 + iVar57 >> auVar143;
  local_338._8_4_ = iStack_590 + iVar57 >> auVar143;
  local_338._12_4_ = iStack_58c + iVar57 >> auVar143;
  local_5a8 = auVar82._0_4_;
  iStack_5a4 = auVar82._4_4_;
  iStack_5a0 = auVar82._8_4_;
  iStack_59c = auVar82._12_4_;
  local_3a8._0_4_ = local_5a8 + iVar57 >> auVar143;
  local_3a8._4_4_ = iStack_5a4 + iVar57 >> auVar143;
  local_3a8._8_4_ = iStack_5a0 + iVar57 >> auVar143;
  local_3a8._12_4_ = iStack_59c + iVar57 >> auVar143;
  auVar115 = pmulld(local_3a8,auVar145);
  auVar146 = pmulld(local_338,auVar128);
  auVar99._4_4_ = iVar58;
  auVar99._0_4_ = iVar58;
  auVar99._8_4_ = iVar58;
  auVar99._12_4_ = iVar58;
  auVar82 = pmulld(local_3a8,auVar128);
  auVar139 = pmulld(local_338,auVar99);
  local_218._0_4_ = auVar140._0_4_ + iVar57 + auVar81._0_4_ >> auVar143;
  local_218._4_4_ = auVar140._4_4_ + iVar57 + auVar81._4_4_ >> auVar143;
  local_218._8_4_ = auVar140._8_4_ + iVar57 + auVar81._8_4_ >> auVar143;
  local_218._12_4_ = auVar140._12_4_ + iVar57 + auVar81._12_4_ >> auVar143;
  local_48._0_4_ = auVar142._0_4_ + iVar57 + auVar76._0_4_ >> auVar143;
  local_48._4_4_ = auVar142._4_4_ + iVar57 + auVar76._4_4_ >> auVar143;
  local_48._8_4_ = auVar142._8_4_ + iVar57 + auVar76._8_4_ >> auVar143;
  local_48._12_4_ = auVar142._12_4_ + iVar57 + auVar76._12_4_ >> auVar143;
  auVar140 = pmulld(local_218,auVar96);
  auVar81 = pmulld(local_48,auVar98);
  puVar63 = &local_228;
  uStack_510 = auVar138._8_8_;
  local_38 = auVar138._0_8_;
  uStack_30 = uStack_510;
  uStack_520 = auVar107._8_8_;
  local_228 = auVar107._0_8_;
  uStack_220 = uStack_520;
  local_1b8 = auVar133._0_4_;
  iStack_1b4 = auVar133._4_4_;
  iStack_1b0 = auVar133._8_4_;
  iStack_1ac = auVar133._12_4_;
  local_a8 = auVar136._0_4_;
  iStack_a4 = auVar136._4_4_;
  iStack_a0 = auVar136._8_4_;
  iStack_9c = auVar136._12_4_;
  local_b8 = auVar97._0_4_;
  iStack_b4 = auVar97._4_4_;
  iStack_b0 = auVar97._8_4_;
  iStack_ac = auVar97._12_4_;
  local_1a8 = auVar87._0_4_;
  iStack_1a4 = auVar87._4_4_;
  iStack_1a0 = auVar87._8_4_;
  iStack_19c = auVar87._12_4_;
  local_138 = auVar124._0_4_;
  iStack_134 = auVar124._4_4_;
  iStack_130 = auVar124._8_4_;
  iStack_12c = auVar124._12_4_;
  local_128[0] = auVar127._0_4_;
  local_128[1] = auVar127._4_4_;
  local_128[2] = auVar127._8_4_;
  local_128[3] = auVar127._12_4_;
  uStack_4b0 = auVar111._8_8_;
  local_238 = auVar111._0_8_;
  uStack_230 = uStack_4b0;
  uStack_4c0 = auVar126._8_8_;
  local_328 = auVar126._0_8_;
  uStack_320 = uStack_4c0;
  local_2b8 = auVar144._0_4_;
  iStack_2b4 = auVar144._4_4_;
  iStack_2b0 = auVar144._8_4_;
  iStack_2ac = auVar144._12_4_;
  local_2a8 = auVar113._0_4_;
  iStack_2a4 = auVar113._4_4_;
  iStack_2a0 = auVar113._8_4_;
  iStack_29c = auVar113._12_4_;
  auVar70 = pmulld(local_218,auVar98);
  auVar142 = pmulld(local_48,auVar110);
  iVar58 = *(int *)(&DAT_004dedc0 + lVar53);
  auVar76._4_4_ = iVar58;
  auVar76._0_4_ = iVar58;
  auVar76._8_4_ = iVar58;
  auVar76._12_4_ = iVar58;
  auVar92 = pmulld((undefined1  [16])*in,auVar76);
  local_608._0_4_ = auVar65._0_4_ + iVar57 + auVar77._0_4_ >> auVar143;
  local_608._4_4_ = auVar65._4_4_ + iVar57 + auVar77._4_4_ >> auVar143;
  local_608._8_4_ = auVar65._8_4_ + iVar57 + auVar77._8_4_ >> auVar143;
  local_608._12_4_ = auVar65._12_4_ + iVar57 + auVar77._12_4_ >> auVar143;
  local_1c8._0_4_ = auVar106._0_4_ + iVar57 + auVar78._0_4_ >> auVar143;
  local_1c8._4_4_ = auVar106._4_4_ + iVar57 + auVar78._4_4_ >> auVar143;
  local_1c8._8_4_ = auVar106._8_4_ + iVar57 + auVar78._8_4_ >> auVar143;
  local_1c8._12_4_ = auVar106._12_4_ + iVar57 + auVar78._12_4_ >> auVar143;
  local_98 = local_608._0_4_;
  iStack_94 = local_608._4_4_;
  iStack_90 = local_608._8_4_;
  iStack_8c = local_608._12_4_;
  local_198._0_4_ = auVar137._0_4_ + iVar57 + auVar88._0_4_ >> auVar143;
  local_198._4_4_ = auVar137._4_4_ + iVar57 + auVar88._4_4_ >> auVar143;
  local_198._8_4_ = auVar137._8_4_ + iVar57 + auVar88._8_4_ >> auVar143;
  local_198._12_4_ = auVar137._12_4_ + iVar57 + auVar88._12_4_ >> auVar143;
  local_c8 = auVar83._0_4_ + iVar57 + auVar79._0_4_ >> auVar143;
  iStack_c4 = auVar83._4_4_ + iVar57 + auVar79._4_4_ >> auVar143;
  iStack_c0 = auVar83._8_4_ + iVar57 + auVar79._8_4_ >> auVar143;
  iStack_bc = auVar83._12_4_ + iVar57 + auVar79._12_4_ >> auVar143;
  local_148._0_4_ = auVar134._0_4_ + iVar57 + auVar84._0_4_ >> auVar143;
  local_148._4_4_ = auVar134._4_4_ + iVar57 + auVar84._4_4_ >> auVar143;
  local_148._8_4_ = auVar134._8_4_ + iVar57 + auVar84._8_4_ >> auVar143;
  local_148._12_4_ = auVar134._12_4_ + iVar57 + auVar84._12_4_ >> auVar143;
  local_128[4] = auVar125._0_4_ + iVar57 + auVar89._0_4_ >> auVar143;
  local_128[5] = auVar125._4_4_ + iVar57 + auVar89._4_4_ >> auVar143;
  local_128[6] = auVar125._8_4_ + iVar57 + auVar89._8_4_ >> auVar143;
  iStack_10c = auVar125._12_4_ + iVar57 + auVar89._12_4_ >> auVar143;
  local_318._0_4_ = auVar85._0_4_ + iVar57 + auVar90._0_4_ >> auVar143;
  local_318._4_4_ = auVar85._4_4_ + iVar57 + auVar90._4_4_ >> auVar143;
  local_318._8_4_ = auVar85._8_4_ + iVar57 + auVar90._8_4_ >> auVar143;
  local_318._12_4_ = auVar85._12_4_ + iVar57 + auVar90._12_4_ >> auVar143;
  local_248 = auVar112._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_244 = auVar112._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_240 = auVar112._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_23c = auVar112._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  local_628._0_4_ = auVar80._0_4_ + iVar57 + auVar114._0_4_ >> auVar143;
  local_628._4_4_ = auVar80._4_4_ + iVar57 + auVar114._4_4_ >> auVar143;
  local_628._8_4_ = auVar80._8_4_ + iVar57 + auVar114._8_4_ >> auVar143;
  local_628._12_4_ = auVar80._12_4_ + iVar57 + auVar114._12_4_ >> auVar143;
  local_618._0_4_ = auVar69._0_4_ + iVar57 + auVar91._0_4_ >> auVar143;
  local_618._4_4_ = auVar69._4_4_ + iVar57 + auVar91._4_4_ >> auVar143;
  local_618._8_4_ = auVar69._8_4_ + iVar57 + auVar91._8_4_ >> auVar143;
  local_618._12_4_ = auVar69._12_4_ + iVar57 + auVar91._12_4_ >> auVar143;
  local_298 = local_618._0_4_;
  iStack_294 = local_618._4_4_;
  iStack_290 = local_618._8_4_;
  iStack_28c = local_618._12_4_;
  local_428[4] = auVar92._0_4_ + iVar57 >> auVar143;
  local_428[5] = auVar92._4_4_ + iVar57 >> auVar143;
  local_428[6] = auVar92._8_4_ + iVar57 >> auVar143;
  local_428[7] = auVar92._12_4_ + iVar57 >> auVar143;
  local_2c8 = local_628._0_4_;
  iStack_2c4 = local_628._4_4_;
  iStack_2c0 = local_628._8_4_;
  iStack_2bc = local_628._12_4_;
  local_398 = auVar146._0_4_ + iVar57 + auVar115._0_4_ >> auVar143;
  iStack_394 = auVar146._4_4_ + iVar57 + auVar115._4_4_ >> auVar143;
  iStack_390 = auVar146._8_4_ + iVar57 + auVar115._8_4_ >> auVar143;
  iStack_38c = auVar146._12_4_ + iVar57 + auVar115._12_4_ >> auVar143;
  local_428[0] = local_428[4];
  local_428[1] = local_428[5];
  local_428[2] = local_428[6];
  local_428[3] = local_428[7];
  local_348 = auVar139._0_4_ + iVar57 + auVar82._0_4_ >> auVar143;
  iStack_344 = auVar139._4_4_ + iVar57 + auVar82._4_4_ >> auVar143;
  iStack_340 = auVar139._8_4_ + iVar57 + auVar82._8_4_ >> auVar143;
  iStack_33c = auVar139._12_4_ + iVar57 + auVar82._12_4_ >> auVar143;
  local_58 = auVar70._0_4_ + iVar57 + auVar142._0_4_ >> auVar143;
  iStack_54 = auVar70._4_4_ + iVar57 + auVar142._4_4_ >> auVar143;
  iStack_50 = auVar70._8_4_ + iVar57 + auVar142._8_4_ >> auVar143;
  iStack_4c = auVar70._12_4_ + iVar57 + auVar142._12_4_ >> auVar143;
  local_208 = auVar140._0_4_ + iVar57 + auVar81._0_4_ >> auVar143;
  iStack_204 = auVar140._4_4_ + iVar57 + auVar81._4_4_ >> auVar143;
  iStack_200 = auVar140._8_4_ + iVar57 + auVar81._8_4_ >> auVar143;
  iStack_1fc = auVar140._12_4_ + iVar57 + auVar81._12_4_ >> auVar143;
  auVar69 = pmulld(auVar107,auVar96);
  auVar80 = pmulld(auVar138,auVar98);
  auVar65 = pmulld(auVar138,auVar110);
  auVar86 = pmulld(auVar107,auVar98);
  local_68 = auVar65._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_64 = auVar65._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_60 = auVar65._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_5c = auVar65._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  local_1f8 = auVar80._0_4_ + iVar57 + auVar69._0_4_ >> auVar143;
  iStack_1f4 = auVar80._4_4_ + iVar57 + auVar69._4_4_ >> auVar143;
  iStack_1f0 = auVar80._8_4_ + iVar57 + auVar69._8_4_ >> auVar143;
  iStack_1ec = auVar80._12_4_ + iVar57 + auVar69._12_4_ >> auVar143;
  iVar59 = -iVar59;
  auVar77._4_4_ = iVar59;
  auVar77._0_4_ = iVar59;
  auVar77._8_4_ = iVar59;
  auVar77._12_4_ = iVar59;
  auVar69 = pmulld(auVar133,auVar77);
  auVar86 = pmulld(auVar136,auVar96);
  auVar65 = pmulld(auVar133,auVar96);
  auVar80 = pmulld(auVar136,auVar98);
  local_78 = auVar80._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_74 = auVar80._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_70 = auVar80._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_6c = auVar80._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_1e8 = auVar86._0_4_ + iVar57 + auVar69._0_4_ >> auVar143;
  iStack_1e4 = auVar86._4_4_ + iVar57 + auVar69._4_4_ >> auVar143;
  iStack_1e0 = auVar86._8_4_ + iVar57 + auVar69._8_4_ >> auVar143;
  iStack_1dc = auVar86._12_4_ + iVar57 + auVar69._12_4_ >> auVar143;
  auVar69 = pmulld(auVar77,local_1c8);
  auVar80 = pmulld(local_608,auVar96);
  auVar86 = pmulld(local_1c8,auVar96);
  auVar65 = pmulld(local_608,auVar98);
  local_88 = auVar65._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_84 = auVar65._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_80 = auVar65._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_7c = auVar65._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  local_1d8 = auVar80._0_4_ + iVar57 + auVar69._0_4_ >> auVar143;
  iStack_1d4 = auVar80._4_4_ + iVar57 + auVar69._4_4_ >> auVar143;
  iStack_1d0 = auVar80._8_4_ + iVar57 + auVar69._8_4_ >> auVar143;
  iStack_1cc = auVar80._12_4_ + iVar57 + auVar69._12_4_ >> auVar143;
  auVar69 = pmulld(local_198,auVar123);
  auVar86._4_4_ = iStack_c4;
  auVar86._0_4_ = local_c8;
  auVar86._8_4_ = iStack_c0;
  auVar86._12_4_ = iStack_bc;
  auVar80 = pmulld(auVar86,auVar135);
  auVar114._4_4_ = iVar60;
  auVar114._0_4_ = iVar60;
  auVar114._8_4_ = iVar60;
  auVar114._12_4_ = iVar60;
  auVar138 = pmulld(local_198,auVar135);
  auVar65 = pmulld(auVar86,auVar114);
  local_d8 = auVar138._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_d4 = auVar138._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_d0 = auVar138._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_cc = auVar138._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_188 = auVar69._0_4_ + iVar57 + auVar80._0_4_ >> auVar143;
  iStack_184 = auVar69._4_4_ + iVar57 + auVar80._4_4_ >> auVar143;
  iStack_180 = auVar69._8_4_ + iVar57 + auVar80._8_4_ >> auVar143;
  iStack_17c = auVar69._12_4_ + iVar57 + auVar80._12_4_ >> auVar143;
  auVar69 = pmulld(auVar87,auVar123);
  auVar80 = pmulld(auVar97,auVar135);
  auVar65 = pmulld(auVar97,auVar114);
  auVar86 = pmulld(auVar87,auVar135);
  local_e8 = auVar65._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_e4 = auVar65._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_e0 = auVar65._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_dc = auVar65._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  local_178 = auVar80._0_4_ + iVar57 + auVar69._0_4_ >> auVar143;
  iStack_174 = auVar80._4_4_ + iVar57 + auVar69._4_4_ >> auVar143;
  iStack_170 = auVar80._8_4_ + iVar57 + auVar69._8_4_ >> auVar143;
  iStack_16c = auVar80._12_4_ + iVar57 + auVar69._12_4_ >> auVar143;
  auVar86 = pmulld(auVar124,auVar132);
  auVar80 = pmulld(auVar127,auVar123);
  auVar65 = pmulld(auVar124,auVar123);
  auVar69 = pmulld(auVar127,auVar135);
  local_f8 = auVar69._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_f4 = auVar69._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_f0 = auVar69._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_ec = auVar69._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_168 = auVar80._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_164 = auVar80._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_160 = auVar80._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_15c = auVar80._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  auVar69 = pmulld(auVar132,local_148);
  auVar65._4_4_ = local_128[5];
  auVar65._0_4_ = local_128[4];
  auVar65._8_4_ = local_128[6];
  auVar65._12_4_ = iStack_10c;
  auVar86 = pmulld(auVar65,auVar123);
  auVar80 = pmulld(local_148,auVar123);
  auVar65 = pmulld(auVar65,auVar135);
  local_108 = auVar80._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_104 = auVar80._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_100 = auVar80._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_fc = auVar80._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_158 = auVar69._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_154 = auVar69._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_150 = auVar69._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_14c = auVar69._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  local_428[0xc] = local_428[4];
  local_428[0xd] = local_428[5];
  local_428[0xe] = local_428[6];
  local_428[0xf] = local_428[7];
  local_428[8] = local_428[4];
  local_428[9] = local_428[5];
  local_428[10] = local_428[6];
  local_428[0xb] = local_428[7];
  local_378 = local_3a8._0_4_;
  iStack_374 = local_3a8._4_4_;
  iStack_370 = local_3a8._8_4_;
  iStack_36c = local_3a8._12_4_;
  local_388 = local_398;
  iStack_384 = iStack_394;
  iStack_380 = iStack_390;
  iStack_37c = iStack_38c;
  local_368 = local_338._0_4_;
  iStack_364 = local_338._4_4_;
  iStack_360 = local_338._8_4_;
  iStack_35c = local_338._12_4_;
  auVar86 = pmulld(local_318,auVar145);
  auVar69._4_4_ = iStack_244;
  auVar69._0_4_ = local_248;
  auVar69._8_4_ = iStack_240;
  auVar69._12_4_ = iStack_23c;
  auVar138 = pmulld(auVar69,auVar128);
  auVar80 = pmulld(local_318,auVar128);
  auVar65 = pmulld(auVar69,auVar99);
  local_358 = local_348;
  iStack_354 = iStack_344;
  iStack_350 = iStack_340;
  iStack_34c = iStack_33c;
  local_258 = auVar80._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_254 = auVar80._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_250 = auVar80._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_24c = auVar80._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_308 = auVar86._0_4_ + iVar57 + auVar138._0_4_ >> auVar143;
  iStack_304 = auVar86._4_4_ + iVar57 + auVar138._4_4_ >> auVar143;
  iStack_300 = auVar86._8_4_ + iVar57 + auVar138._8_4_ >> auVar143;
  iStack_2fc = auVar86._12_4_ + iVar57 + auVar138._12_4_ >> auVar143;
  auVar86 = pmulld(auVar126,auVar145);
  auVar80 = pmulld(auVar111,auVar128);
  iVar61 = -iVar61;
  auVar65 = pmulld(auVar126,auVar128);
  auVar69 = pmulld(auVar111,auVar99);
  auVar78._4_4_ = iVar61;
  auVar78._0_4_ = iVar61;
  auVar78._8_4_ = iVar61;
  auVar78._12_4_ = iVar61;
  local_268 = auVar69._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_264 = auVar69._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_260 = auVar69._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_25c = auVar69._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_2f8 = auVar80._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_2f4 = auVar80._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_2f0 = auVar80._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_2ec = auVar80._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  auVar86 = pmulld(auVar144,auVar78);
  auVar80 = pmulld(auVar113,auVar145);
  auVar65 = pmulld(auVar144,auVar145);
  auVar69 = pmulld(auVar113,auVar128);
  local_278 = auVar69._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_274 = auVar69._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_270 = auVar69._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_26c = auVar69._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_2e8 = auVar80._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_2e4 = auVar80._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_2e0 = auVar80._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_2dc = auVar80._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  auVar80 = pmulld(local_628,auVar78);
  auVar86 = pmulld(local_618,auVar145);
  iVar59 = -iVar50;
  auVar69 = pmulld(local_628,auVar145);
  auVar65 = pmulld(local_618,auVar128);
  iVar50 = iVar50 + -1;
  local_288 = auVar69._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_284 = auVar69._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_280 = auVar69._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_27c = auVar69._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  iVar58 = -iVar58;
  local_2d8 = auVar80._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_2d4 = auVar80._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_2d0 = auVar80._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_2cc = auVar80._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  uVar54 = 0x20;
  do {
    lVar52 = 0;
    uVar55 = uVar54;
    do {
      piVar1 = (int *)((long)puVar63 + lVar52);
      uVar56 = uVar55 ^ 7;
      iVar108 = local_428[uVar56 * 4] + *piVar1;
      iVar117 = local_428[uVar56 * 4 + 1] + piVar1[1];
      iVar119 = local_428[uVar56 * 4 + 2] + piVar1[2];
      iVar121 = local_428[uVar56 * 4 + 3] + piVar1[3];
      iVar60 = *piVar1 - local_428[uVar56 * 4];
      iVar61 = piVar1[1] - local_428[uVar56 * 4 + 1];
      iVar62 = piVar1[2] - local_428[uVar56 * 4 + 2];
      iVar104 = piVar1[3] - local_428[uVar56 * 4 + 3];
      uVar109 = (uint)(iVar108 < iVar59) * iVar59 | (uint)(iVar108 >= iVar59) * iVar108;
      uVar118 = (uint)(iVar117 < iVar59) * iVar59 | (uint)(iVar117 >= iVar59) * iVar117;
      uVar120 = (uint)(iVar119 < iVar59) * iVar59 | (uint)(iVar119 >= iVar59) * iVar119;
      uVar122 = (uint)(iVar121 < iVar59) * iVar59 | (uint)(iVar121 >= iVar59) * iVar121;
      uVar95 = (uint)(iVar60 < iVar59) * iVar59 | (uint)(iVar60 >= iVar59) * iVar60;
      uVar102 = (uint)(iVar61 < iVar59) * iVar59 | (uint)(iVar61 >= iVar59) * iVar61;
      uVar103 = (uint)(iVar62 < iVar59) * iVar59 | (uint)(iVar62 >= iVar59) * iVar62;
      uVar105 = (uint)(iVar104 < iVar59) * iVar59 | (uint)(iVar104 >= iVar59) * iVar104;
      puVar51 = (uint *)((long)puVar63 + lVar52);
      *puVar51 = (uint)(iVar50 < (int)uVar109) * iVar50 | (iVar50 >= (int)uVar109) * uVar109;
      puVar51[1] = (uint)(iVar50 < (int)uVar118) * iVar50 | (iVar50 >= (int)uVar118) * uVar118;
      puVar51[2] = (uint)(iVar50 < (int)uVar120) * iVar50 | (iVar50 >= (int)uVar120) * uVar120;
      puVar51[3] = (uint)(iVar50 < (int)uVar122) * iVar50 | (iVar50 >= (int)uVar122) * uVar122;
      local_428[uVar56 * 4] =
           (uint)(iVar50 < (int)uVar95) * iVar50 | (iVar50 >= (int)uVar95) * uVar95;
      local_428[uVar56 * 4 + 1] =
           (uint)(iVar50 < (int)uVar102) * iVar50 | (iVar50 >= (int)uVar102) * uVar102;
      local_428[uVar56 * 4 + 2] =
           (uint)(iVar50 < (int)uVar103) * iVar50 | (iVar50 >= (int)uVar103) * uVar103;
      local_428[uVar56 * 4 + 3] =
           (uint)(iVar50 < (int)uVar105) * iVar50 | (iVar50 >= (int)uVar105) * uVar105;
      uVar56 = uVar55 ^ 0xf;
      uVar64 = uVar55 ^ 8;
      iVar108 = local_428[uVar64 * 4] + local_428[uVar56 * 4];
      iVar117 = local_428[uVar64 * 4 + 1] + local_428[uVar56 * 4 + 1];
      iVar119 = local_428[uVar64 * 4 + 2] + local_428[uVar56 * 4 + 2];
      iVar121 = local_428[uVar64 * 4 + 3] + local_428[uVar56 * 4 + 3];
      iVar60 = local_428[uVar56 * 4] - local_428[uVar64 * 4];
      iVar61 = local_428[uVar56 * 4 + 1] - local_428[uVar64 * 4 + 1];
      iVar62 = local_428[uVar56 * 4 + 2] - local_428[uVar64 * 4 + 2];
      iVar104 = local_428[uVar56 * 4 + 3] - local_428[uVar64 * 4 + 3];
      uVar109 = (uint)(iVar108 < iVar59) * iVar59 | (uint)(iVar108 >= iVar59) * iVar108;
      uVar118 = (uint)(iVar117 < iVar59) * iVar59 | (uint)(iVar117 >= iVar59) * iVar117;
      uVar120 = (uint)(iVar119 < iVar59) * iVar59 | (uint)(iVar119 >= iVar59) * iVar119;
      uVar122 = (uint)(iVar121 < iVar59) * iVar59 | (uint)(iVar121 >= iVar59) * iVar121;
      uVar95 = (uint)(iVar60 < iVar59) * iVar59 | (uint)(iVar60 >= iVar59) * iVar60;
      uVar102 = (uint)(iVar61 < iVar59) * iVar59 | (uint)(iVar61 >= iVar59) * iVar61;
      uVar103 = (uint)(iVar62 < iVar59) * iVar59 | (uint)(iVar62 >= iVar59) * iVar62;
      uVar105 = (uint)(iVar104 < iVar59) * iVar59 | (uint)(iVar104 >= iVar59) * iVar104;
      local_428[uVar56 * 4] =
           (uint)(iVar50 < (int)uVar109) * iVar50 | (iVar50 >= (int)uVar109) * uVar109;
      local_428[uVar56 * 4 + 1] =
           (uint)(iVar50 < (int)uVar118) * iVar50 | (iVar50 >= (int)uVar118) * uVar118;
      local_428[uVar56 * 4 + 2] =
           (uint)(iVar50 < (int)uVar120) * iVar50 | (iVar50 >= (int)uVar120) * uVar120;
      local_428[uVar56 * 4 + 3] =
           (uint)(iVar50 < (int)uVar122) * iVar50 | (iVar50 >= (int)uVar122) * uVar122;
      local_428[uVar64 * 4] =
           (uint)(iVar50 < (int)uVar95) * iVar50 | (iVar50 >= (int)uVar95) * uVar95;
      local_428[uVar64 * 4 + 1] =
           (uint)(iVar50 < (int)uVar102) * iVar50 | (iVar50 >= (int)uVar102) * uVar102;
      local_428[uVar64 * 4 + 2] =
           (uint)(iVar50 < (int)uVar103) * iVar50 | (iVar50 >= (int)uVar103) * uVar103;
      local_428[uVar64 * 4 + 3] =
           (uint)(iVar50 < (int)uVar105) * iVar50 | (iVar50 >= (int)uVar105) * uVar105;
      uVar55 = uVar55 + 1;
      lVar52 = lVar52 + 0x10;
    } while (lVar52 != 0x40);
    puVar63 = puVar63 + 0x20;
    uVar95 = (uint)uVar54;
    uVar54 = uVar54 + 0x10;
  } while (uVar95 < 0x30);
  auVar71._4_4_ = iVar58;
  auVar71._0_4_ = iVar58;
  auVar71._8_4_ = iVar58;
  auVar71._12_4_ = iVar58;
  puVar51 = (uint *)&local_328;
  local_3b8 = CONCAT44(local_428[1],local_428[0]);
  uStack_3b0 = CONCAT44(local_428[3],local_428[2]);
  local_3c8 = CONCAT44(local_428[5],local_428[4]);
  uStack_3c0 = CONCAT44(local_428[7],local_428[6]);
  local_3d8 = CONCAT44(local_428[9],local_428[8]);
  uStack_3d0 = CONCAT44(local_428[0xb],local_428[10]);
  local_3e8 = CONCAT44(local_428[0xd],local_428[0xc]);
  uStack_3e0 = CONCAT44(local_428[0xf],local_428[0xe]);
  auVar3._4_4_ = iStack_384;
  auVar3._0_4_ = local_388;
  auVar3._8_4_ = iStack_380;
  auVar3._12_4_ = iStack_37c;
  auVar6._4_4_ = iStack_354;
  auVar6._0_4_ = local_358;
  auVar6._8_4_ = iStack_350;
  auVar6._12_4_ = iStack_34c;
  auVar100._0_4_ = local_358 + local_388;
  auVar100._4_4_ = iStack_354 + iStack_384;
  auVar100._8_4_ = iStack_350 + iStack_380;
  auVar100._12_4_ = iStack_34c + iStack_37c;
  auVar65 = pmulld(auVar3,auVar71);
  auVar86 = pmulld(auVar6,auVar76);
  auVar69 = pmulld(auVar100,auVar76);
  local_358 = auVar69._0_4_ + iVar57 >> auVar143;
  iStack_354 = auVar69._4_4_ + iVar57 >> auVar143;
  iStack_350 = auVar69._8_4_ + iVar57 >> auVar143;
  iStack_34c = auVar69._12_4_ + iVar57 >> auVar143;
  local_388 = auVar65._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_384 = auVar65._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_380 = auVar65._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_37c = auVar65._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  auVar4._4_4_ = iStack_374;
  auVar4._0_4_ = local_378;
  auVar4._8_4_ = iStack_370;
  auVar4._12_4_ = iStack_36c;
  auVar5._4_4_ = iStack_364;
  auVar5._0_4_ = local_368;
  auVar5._8_4_ = iStack_360;
  auVar5._12_4_ = iStack_35c;
  auVar101._0_4_ = local_368 + local_378;
  auVar101._4_4_ = iStack_364 + iStack_374;
  auVar101._8_4_ = iStack_360 + iStack_370;
  auVar101._12_4_ = iStack_35c + iStack_36c;
  auVar65 = pmulld(auVar4,auVar71);
  auVar86 = pmulld(auVar5,auVar76);
  auVar69 = pmulld(auVar101,auVar76);
  local_368 = auVar69._0_4_ + iVar57 >> auVar143;
  iStack_364 = auVar69._4_4_ + iVar57 >> auVar143;
  iStack_360 = auVar69._8_4_ + iVar57 >> auVar143;
  iStack_35c = auVar69._12_4_ + iVar57 >> auVar143;
  local_378 = auVar65._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_374 = auVar65._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_370 = auVar65._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_36c = auVar65._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  uVar54 = 0x10;
  do {
    uVar55 = uVar54 ^ 7;
    iVar104 = local_428[uVar55 * 4] + *puVar51;
    iVar108 = local_428[uVar55 * 4 + 1] + puVar51[1];
    iVar117 = local_428[uVar55 * 4 + 2] + puVar51[2];
    iVar119 = local_428[uVar55 * 4 + 3] + puVar51[3];
    iVar58 = *puVar51 - local_428[uVar55 * 4];
    iVar60 = puVar51[1] - local_428[uVar55 * 4 + 1];
    iVar61 = puVar51[2] - local_428[uVar55 * 4 + 2];
    iVar62 = puVar51[3] - local_428[uVar55 * 4 + 3];
    uVar109 = (uint)(iVar104 < iVar59) * iVar59 | (uint)(iVar104 >= iVar59) * iVar104;
    uVar118 = (uint)(iVar108 < iVar59) * iVar59 | (uint)(iVar108 >= iVar59) * iVar108;
    uVar120 = (uint)(iVar117 < iVar59) * iVar59 | (uint)(iVar117 >= iVar59) * iVar117;
    uVar122 = (uint)(iVar119 < iVar59) * iVar59 | (uint)(iVar119 >= iVar59) * iVar119;
    uVar95 = (uint)(iVar58 < iVar59) * iVar59 | (uint)(iVar58 >= iVar59) * iVar58;
    uVar102 = (uint)(iVar60 < iVar59) * iVar59 | (uint)(iVar60 >= iVar59) * iVar60;
    uVar103 = (uint)(iVar61 < iVar59) * iVar59 | (uint)(iVar61 >= iVar59) * iVar61;
    uVar105 = (uint)(iVar62 < iVar59) * iVar59 | (uint)(iVar62 >= iVar59) * iVar62;
    *puVar51 = (uint)(iVar50 < (int)uVar109) * iVar50 | (iVar50 >= (int)uVar109) * uVar109;
    puVar51[1] = (uint)(iVar50 < (int)uVar118) * iVar50 | (iVar50 >= (int)uVar118) * uVar118;
    puVar51[2] = (uint)(iVar50 < (int)uVar120) * iVar50 | (iVar50 >= (int)uVar120) * uVar120;
    puVar51[3] = (uint)(iVar50 < (int)uVar122) * iVar50 | (iVar50 >= (int)uVar122) * uVar122;
    local_428[uVar55 * 4] = (uint)(iVar50 < (int)uVar95) * iVar50 | (iVar50 >= (int)uVar95) * uVar95
    ;
    local_428[uVar55 * 4 + 1] =
         (uint)(iVar50 < (int)uVar102) * iVar50 | (iVar50 >= (int)uVar102) * uVar102;
    local_428[uVar55 * 4 + 2] =
         (uint)(iVar50 < (int)uVar103) * iVar50 | (iVar50 >= (int)uVar103) * uVar103;
    local_428[uVar55 * 4 + 3] =
         (uint)(iVar50 < (int)uVar105) * iVar50 | (iVar50 >= (int)uVar105) * uVar105;
    uVar55 = uVar54 ^ 0xf;
    uVar56 = uVar54 ^ 8;
    iVar104 = local_428[uVar56 * 4] + local_428[uVar55 * 4];
    iVar108 = local_428[uVar56 * 4 + 1] + local_428[uVar55 * 4 + 1];
    iVar117 = local_428[uVar56 * 4 + 2] + local_428[uVar55 * 4 + 2];
    iVar119 = local_428[uVar56 * 4 + 3] + local_428[uVar55 * 4 + 3];
    iVar58 = local_428[uVar55 * 4] - local_428[uVar56 * 4];
    iVar60 = local_428[uVar55 * 4 + 1] - local_428[uVar56 * 4 + 1];
    iVar61 = local_428[uVar55 * 4 + 2] - local_428[uVar56 * 4 + 2];
    iVar62 = local_428[uVar55 * 4 + 3] - local_428[uVar56 * 4 + 3];
    uVar109 = (uint)(iVar104 < iVar59) * iVar59 | (uint)(iVar104 >= iVar59) * iVar104;
    uVar118 = (uint)(iVar108 < iVar59) * iVar59 | (uint)(iVar108 >= iVar59) * iVar108;
    uVar120 = (uint)(iVar117 < iVar59) * iVar59 | (uint)(iVar117 >= iVar59) * iVar117;
    uVar122 = (uint)(iVar119 < iVar59) * iVar59 | (uint)(iVar119 >= iVar59) * iVar119;
    uVar95 = (uint)(iVar58 < iVar59) * iVar59 | (uint)(iVar58 >= iVar59) * iVar58;
    uVar102 = (uint)(iVar60 < iVar59) * iVar59 | (uint)(iVar60 >= iVar59) * iVar60;
    uVar103 = (uint)(iVar61 < iVar59) * iVar59 | (uint)(iVar61 >= iVar59) * iVar61;
    uVar105 = (uint)(iVar62 < iVar59) * iVar59 | (uint)(iVar62 >= iVar59) * iVar62;
    local_428[uVar55 * 4] =
         (uint)(iVar50 < (int)uVar109) * iVar50 | (iVar50 >= (int)uVar109) * uVar109;
    local_428[uVar55 * 4 + 1] =
         (uint)(iVar50 < (int)uVar118) * iVar50 | (iVar50 >= (int)uVar118) * uVar118;
    local_428[uVar55 * 4 + 2] =
         (uint)(iVar50 < (int)uVar120) * iVar50 | (iVar50 >= (int)uVar120) * uVar120;
    local_428[uVar55 * 4 + 3] =
         (uint)(iVar50 < (int)uVar122) * iVar50 | (iVar50 >= (int)uVar122) * uVar122;
    local_428[uVar56 * 4] = (uint)(iVar50 < (int)uVar95) * iVar50 | (iVar50 >= (int)uVar95) * uVar95
    ;
    local_428[uVar56 * 4 + 1] =
         (uint)(iVar50 < (int)uVar102) * iVar50 | (iVar50 >= (int)uVar102) * uVar102;
    local_428[uVar56 * 4 + 2] =
         (uint)(iVar50 < (int)uVar103) * iVar50 | (iVar50 >= (int)uVar103) * uVar103;
    local_428[uVar56 * 4 + 3] =
         (uint)(iVar50 < (int)uVar105) * iVar50 | (iVar50 >= (int)uVar105) * uVar105;
    uVar54 = uVar54 + 1;
    puVar51 = puVar51 + 4;
  } while (uVar54 != 0x14);
  puVar51 = (uint *)local_338;
  auVar42._4_4_ = iStack_74;
  auVar42._0_4_ = local_78;
  auVar42._8_4_ = iStack_70;
  auVar42._12_4_ = iStack_6c;
  auVar15._4_4_ = iStack_1e4;
  auVar15._0_4_ = local_1e8;
  auVar15._8_4_ = iStack_1e0;
  auVar15._12_4_ = iStack_1dc;
  auVar16._4_4_ = iStack_1d4;
  auVar16._0_4_ = local_1d8;
  auVar16._8_4_ = iStack_1d0;
  auVar16._12_4_ = iStack_1cc;
  auVar17._4_4_ = iStack_1b4;
  auVar17._0_4_ = local_1b8;
  auVar17._8_4_ = iStack_1b0;
  auVar17._12_4_ = iStack_1ac;
  auVar106 = pmulld(auVar15,auVar145);
  auVar80 = pmulld(auVar42,auVar128);
  auVar41._4_4_ = iStack_84;
  auVar41._0_4_ = local_88;
  auVar41._8_4_ = iStack_80;
  auVar41._12_4_ = iStack_7c;
  auVar96 = pmulld(auVar16,auVar145);
  auVar138 = pmulld(auVar41,auVar128);
  auVar40._4_4_ = iStack_94;
  auVar40._0_4_ = local_98;
  auVar40._8_4_ = iStack_90;
  auVar40._12_4_ = iStack_8c;
  auVar110 = pmulld(local_1c8,auVar145);
  auVar126 = pmulld(auVar40,auVar128);
  auVar39._4_4_ = iStack_a4;
  auVar39._0_4_ = local_a8;
  auVar39._8_4_ = iStack_a0;
  auVar39._12_4_ = iStack_9c;
  auVar132 = pmulld(auVar17,auVar145);
  auVar86 = pmulld(auVar39,auVar128);
  auVar70 = pmulld(auVar17,auVar128);
  auVar65 = pmulld(auVar39,auVar99);
  auVar123 = pmulld(local_1c8,auVar128);
  auVar69 = pmulld(auVar40,auVar99);
  local_a8 = auVar70._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_a4 = auVar70._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_a0 = auVar70._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_9c = auVar70._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_98 = auVar123._0_4_ + iVar57 + auVar69._0_4_ >> auVar143;
  iStack_94 = auVar123._4_4_ + iVar57 + auVar69._4_4_ >> auVar143;
  iStack_90 = auVar123._8_4_ + iVar57 + auVar69._8_4_ >> auVar143;
  iStack_8c = auVar123._12_4_ + iVar57 + auVar69._12_4_ >> auVar143;
  auVar69 = pmulld(auVar16,auVar128);
  auVar65 = pmulld(auVar41,auVar99);
  local_88 = auVar69._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_84 = auVar69._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_80 = auVar69._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_7c = auVar69._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  auVar69 = pmulld(auVar15,auVar128);
  auVar65 = pmulld(auVar42,auVar99);
  local_78 = auVar69._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_74 = auVar69._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_70 = auVar69._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_6c = auVar69._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_1e8 = auVar106._0_4_ + iVar57 + auVar80._0_4_ >> auVar143;
  iStack_1e4 = auVar106._4_4_ + iVar57 + auVar80._4_4_ >> auVar143;
  iStack_1e0 = auVar106._8_4_ + iVar57 + auVar80._8_4_ >> auVar143;
  iStack_1dc = auVar106._12_4_ + iVar57 + auVar80._12_4_ >> auVar143;
  local_1d8 = auVar96._0_4_ + iVar57 + auVar138._0_4_ >> auVar143;
  iStack_1d4 = auVar96._4_4_ + iVar57 + auVar138._4_4_ >> auVar143;
  iStack_1d0 = auVar96._8_4_ + iVar57 + auVar138._8_4_ >> auVar143;
  iStack_1cc = auVar96._12_4_ + iVar57 + auVar138._12_4_ >> auVar143;
  local_1c8._4_4_ = auVar110._4_4_ + iVar57 + auVar126._4_4_ >> auVar143;
  local_1c8._0_4_ = auVar110._0_4_ + iVar57 + auVar126._0_4_ >> auVar143;
  local_1c8._8_4_ = auVar110._8_4_ + iVar57 + auVar126._8_4_ >> auVar143;
  local_1c8._12_4_ = auVar110._12_4_ + iVar57 + auVar126._12_4_ >> auVar143;
  local_1b8 = auVar132._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_1b4 = auVar132._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_1b0 = auVar132._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_1ac = auVar132._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  auVar18._4_4_ = iStack_1a4;
  auVar18._0_4_ = local_1a8;
  auVar18._8_4_ = iStack_1a0;
  auVar18._12_4_ = iStack_19c;
  auVar37._4_4_ = iStack_b4;
  auVar37._0_4_ = local_b8;
  auVar37._8_4_ = iStack_b0;
  auVar37._12_4_ = iStack_ac;
  auVar96 = pmulld(auVar18,auVar78);
  auVar65 = pmulld(auVar37,auVar145);
  auVar35._4_4_ = iStack_c4;
  auVar35._0_4_ = local_c8;
  auVar35._8_4_ = iStack_c0;
  auVar35._12_4_ = iStack_bc;
  auVar110 = pmulld(local_198,auVar78);
  auVar69 = pmulld(auVar35,auVar145);
  auVar20._4_4_ = iStack_184;
  auVar20._0_4_ = local_188;
  auVar20._8_4_ = iStack_180;
  auVar20._12_4_ = iStack_17c;
  auVar33._4_4_ = iStack_d4;
  auVar33._0_4_ = local_d8;
  auVar33._8_4_ = iStack_d0;
  auVar33._12_4_ = iStack_cc;
  auVar123 = pmulld(auVar20,auVar78);
  auVar86 = pmulld(auVar33,auVar145);
  auVar22._4_4_ = iStack_174;
  auVar22._0_4_ = local_178;
  auVar22._8_4_ = iStack_170;
  auVar22._12_4_ = iStack_16c;
  auVar31._4_4_ = iStack_e4;
  auVar31._0_4_ = local_e8;
  auVar31._8_4_ = iStack_e0;
  auVar31._12_4_ = iStack_dc;
  auVar138 = pmulld(auVar78,auVar22);
  auVar80 = pmulld(auVar22,auVar145);
  auVar106 = pmulld(auVar31,auVar128);
  auVar70 = pmulld(auVar31,auVar145);
  local_e8 = auVar80._0_4_ + iVar57 + auVar106._0_4_ >> auVar143;
  iStack_e4 = auVar80._4_4_ + iVar57 + auVar106._4_4_ >> auVar143;
  iStack_e0 = auVar80._8_4_ + iVar57 + auVar106._8_4_ >> auVar143;
  iStack_dc = auVar80._12_4_ + iVar57 + auVar106._12_4_ >> auVar143;
  auVar106 = pmulld(auVar20,auVar145);
  auVar80 = pmulld(auVar33,auVar128);
  local_d8 = auVar106._0_4_ + iVar57 + auVar80._0_4_ >> auVar143;
  iStack_d4 = auVar106._4_4_ + iVar57 + auVar80._4_4_ >> auVar143;
  iStack_d0 = auVar106._8_4_ + iVar57 + auVar80._8_4_ >> auVar143;
  iStack_cc = auVar106._12_4_ + iVar57 + auVar80._12_4_ >> auVar143;
  auVar106 = pmulld(local_198,auVar145);
  auVar80 = pmulld(auVar35,auVar128);
  local_c8 = auVar106._0_4_ + iVar57 + auVar80._0_4_ >> auVar143;
  iStack_c4 = auVar106._4_4_ + iVar57 + auVar80._4_4_ >> auVar143;
  iStack_c0 = auVar106._8_4_ + iVar57 + auVar80._8_4_ >> auVar143;
  iStack_bc = auVar106._12_4_ + iVar57 + auVar80._12_4_ >> auVar143;
  auVar106 = pmulld(auVar18,auVar145);
  auVar80 = pmulld(auVar37,auVar128);
  local_b8 = auVar106._0_4_ + iVar57 + auVar80._0_4_ >> auVar143;
  iStack_b4 = auVar106._4_4_ + iVar57 + auVar80._4_4_ >> auVar143;
  iStack_b0 = auVar106._8_4_ + iVar57 + auVar80._8_4_ >> auVar143;
  iStack_ac = auVar106._12_4_ + iVar57 + auVar80._12_4_ >> auVar143;
  local_1a8 = auVar96._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_1a4 = auVar96._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_1a0 = auVar96._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_19c = auVar96._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_198._4_4_ = auVar110._4_4_ + iVar57 + auVar69._4_4_ >> auVar143;
  local_198._0_4_ = auVar110._0_4_ + iVar57 + auVar69._0_4_ >> auVar143;
  local_198._8_4_ = auVar110._8_4_ + iVar57 + auVar69._8_4_ >> auVar143;
  local_198._12_4_ = auVar110._12_4_ + iVar57 + auVar69._12_4_ >> auVar143;
  local_188 = auVar123._0_4_ + iVar57 + auVar86._0_4_ >> auVar143;
  iStack_184 = auVar123._4_4_ + iVar57 + auVar86._4_4_ >> auVar143;
  iStack_180 = auVar123._8_4_ + iVar57 + auVar86._8_4_ >> auVar143;
  iStack_17c = auVar123._12_4_ + iVar57 + auVar86._12_4_ >> auVar143;
  local_178 = auVar138._0_4_ + iVar57 + auVar70._0_4_ >> auVar143;
  iStack_174 = auVar138._4_4_ + iVar57 + auVar70._4_4_ >> auVar143;
  iStack_170 = auVar138._8_4_ + iVar57 + auVar70._8_4_ >> auVar143;
  iStack_16c = auVar138._12_4_ + iVar57 + auVar70._12_4_ >> auVar143;
  lVar52 = 0;
  do {
    iVar58 = *(int *)((long)local_428 + lVar52 + 4);
    iVar60 = *(int *)((long)local_428 + lVar52 + 8);
    iVar61 = *(int *)((long)local_428 + lVar52 + 0xc);
    iVar104 = *puVar51 + *(int *)((long)local_428 + lVar52);
    iVar108 = puVar51[1] + iVar58;
    iVar117 = puVar51[2] + iVar60;
    iVar119 = puVar51[3] + iVar61;
    iVar62 = *(int *)((long)local_428 + lVar52) - *puVar51;
    iVar58 = iVar58 - puVar51[1];
    iVar60 = iVar60 - puVar51[2];
    iVar61 = iVar61 - puVar51[3];
    uVar109 = (uint)(iVar104 < iVar59) * iVar59 | (uint)(iVar104 >= iVar59) * iVar104;
    uVar118 = (uint)(iVar108 < iVar59) * iVar59 | (uint)(iVar108 >= iVar59) * iVar108;
    uVar120 = (uint)(iVar117 < iVar59) * iVar59 | (uint)(iVar117 >= iVar59) * iVar117;
    uVar122 = (uint)(iVar119 < iVar59) * iVar59 | (uint)(iVar119 >= iVar59) * iVar119;
    uVar95 = (uint)(iVar62 < iVar59) * iVar59 | (uint)(iVar62 >= iVar59) * iVar62;
    uVar102 = (uint)(iVar58 < iVar59) * iVar59 | (uint)(iVar58 >= iVar59) * iVar58;
    uVar103 = (uint)(iVar60 < iVar59) * iVar59 | (uint)(iVar60 >= iVar59) * iVar60;
    uVar105 = (uint)(iVar61 < iVar59) * iVar59 | (uint)(iVar61 >= iVar59) * iVar61;
    *(uint *)((long)local_428 + lVar52) =
         (uint)(iVar50 < (int)uVar109) * iVar50 | (iVar50 >= (int)uVar109) * uVar109;
    *(uint *)((long)local_428 + lVar52 + 4) =
         (uint)(iVar50 < (int)uVar118) * iVar50 | (iVar50 >= (int)uVar118) * uVar118;
    *(uint *)((long)local_428 + lVar52 + 8) =
         (uint)(iVar50 < (int)uVar120) * iVar50 | (iVar50 >= (int)uVar120) * uVar120;
    *(uint *)((long)local_428 + lVar52 + 0xc) =
         (uint)(iVar50 < (int)uVar122) * iVar50 | (iVar50 >= (int)uVar122) * uVar122;
    *puVar51 = (uint)(iVar50 < (int)uVar95) * iVar50 | (iVar50 >= (int)uVar95) * uVar95;
    puVar51[1] = (uint)(iVar50 < (int)uVar102) * iVar50 | (iVar50 >= (int)uVar102) * uVar102;
    puVar51[2] = (uint)(iVar50 < (int)uVar103) * iVar50 | (iVar50 >= (int)uVar103) * uVar103;
    puVar51[3] = (uint)(iVar50 < (int)uVar105) * iVar50 | (iVar50 >= (int)uVar105) * uVar105;
    lVar52 = lVar52 + 0x10;
    puVar51 = puVar51 + -4;
  } while (lVar52 != 0x80);
  puVar51 = (uint *)&local_228;
  auVar14._4_4_ = iStack_274;
  auVar14._0_4_ = local_278;
  auVar14._8_4_ = iStack_270;
  auVar14._12_4_ = iStack_26c;
  auVar7._4_4_ = iStack_2e4;
  auVar7._0_4_ = local_2e8;
  auVar7._8_4_ = iStack_2e0;
  auVar7._12_4_ = iStack_2dc;
  auVar8._4_4_ = iStack_2d4;
  auVar8._0_4_ = local_2d8;
  auVar8._8_4_ = iStack_2d0;
  auVar8._12_4_ = iStack_2cc;
  auVar9._4_4_ = iStack_2c4;
  auVar9._0_4_ = local_2c8;
  auVar9._8_4_ = iStack_2c0;
  auVar9._12_4_ = iStack_2bc;
  auVar10._4_4_ = iStack_2b4;
  auVar10._0_4_ = local_2b8;
  auVar10._8_4_ = iStack_2b0;
  auVar10._12_4_ = iStack_2ac;
  auVar72._0_4_ = local_278 + local_2e8;
  auVar72._4_4_ = iStack_274 + iStack_2e4;
  auVar72._8_4_ = iStack_270 + iStack_2e0;
  auVar72._12_4_ = iStack_26c + iStack_2dc;
  auVar96 = pmulld(auVar7,auVar71);
  auVar110 = pmulld(auVar14,auVar76);
  auVar13._4_4_ = iStack_284;
  auVar13._0_4_ = local_288;
  auVar13._8_4_ = iStack_280;
  auVar13._12_4_ = iStack_27c;
  auVar93._0_4_ = local_288 + local_2d8;
  auVar93._4_4_ = iStack_284 + iStack_2d4;
  auVar93._8_4_ = iStack_280 + iStack_2d0;
  auVar93._12_4_ = iStack_27c + iStack_2cc;
  auVar106 = pmulld(auVar8,auVar71);
  auVar65 = pmulld(auVar13,auVar76);
  auVar12._4_4_ = iStack_294;
  auVar12._0_4_ = local_298;
  auVar12._8_4_ = iStack_290;
  auVar12._12_4_ = iStack_28c;
  auVar66._0_4_ = local_298 + local_2c8;
  auVar66._4_4_ = iStack_294 + iStack_2c4;
  auVar66._8_4_ = iStack_290 + iStack_2c0;
  auVar66._12_4_ = iStack_28c + iStack_2bc;
  auVar138 = pmulld(auVar9,auVar71);
  auVar123 = pmulld(auVar12,auVar76);
  auVar11._4_4_ = iStack_2a4;
  auVar11._0_4_ = local_2a8;
  auVar11._8_4_ = iStack_2a0;
  auVar11._12_4_ = iStack_29c;
  auVar129._0_4_ = local_2a8 + local_2b8;
  auVar129._4_4_ = iStack_2a4 + iStack_2b4;
  auVar129._8_4_ = iStack_2a0 + iStack_2b0;
  auVar129._12_4_ = iStack_29c + iStack_2ac;
  auVar80 = pmulld(auVar10,auVar71);
  auVar70 = pmulld(auVar11,auVar76);
  auVar69 = pmulld(auVar129,auVar76);
  local_2a8 = auVar69._0_4_ + iVar57 >> auVar143;
  iStack_2a4 = auVar69._4_4_ + iVar57 >> auVar143;
  iStack_2a0 = auVar69._8_4_ + iVar57 >> auVar143;
  iStack_29c = auVar69._12_4_ + iVar57 >> auVar143;
  auVar69 = pmulld(auVar66,auVar76);
  auVar86 = pmulld(auVar93,auVar76);
  local_298 = auVar69._0_4_ + iVar57 >> auVar143;
  iStack_294 = auVar69._4_4_ + iVar57 >> auVar143;
  iStack_290 = auVar69._8_4_ + iVar57 >> auVar143;
  iStack_28c = auVar69._12_4_ + iVar57 >> auVar143;
  local_288 = auVar86._0_4_ + iVar57 >> auVar143;
  iStack_284 = auVar86._4_4_ + iVar57 >> auVar143;
  iStack_280 = auVar86._8_4_ + iVar57 >> auVar143;
  iStack_27c = auVar86._12_4_ + iVar57 >> auVar143;
  auVar69 = pmulld(auVar72,auVar76);
  local_278 = auVar69._0_4_ + iVar57 >> auVar143;
  iStack_274 = auVar69._4_4_ + iVar57 >> auVar143;
  iStack_270 = auVar69._8_4_ + iVar57 >> auVar143;
  iStack_26c = auVar69._12_4_ + iVar57 >> auVar143;
  local_2e8 = auVar96._0_4_ + iVar57 + auVar110._0_4_ >> auVar143;
  iStack_2e4 = auVar96._4_4_ + iVar57 + auVar110._4_4_ >> auVar143;
  iStack_2e0 = auVar96._8_4_ + iVar57 + auVar110._8_4_ >> auVar143;
  iStack_2dc = auVar96._12_4_ + iVar57 + auVar110._12_4_ >> auVar143;
  local_2d8 = auVar106._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_2d4 = auVar106._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_2d0 = auVar106._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_2cc = auVar106._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_2c8 = auVar138._0_4_ + iVar57 + auVar123._0_4_ >> auVar143;
  iStack_2c4 = auVar138._4_4_ + iVar57 + auVar123._4_4_ >> auVar143;
  iStack_2c0 = auVar138._8_4_ + iVar57 + auVar123._8_4_ >> auVar143;
  iStack_2bc = auVar138._12_4_ + iVar57 + auVar123._12_4_ >> auVar143;
  local_2b8 = auVar80._0_4_ + iVar57 + auVar70._0_4_ >> auVar143;
  iStack_2b4 = auVar80._4_4_ + iVar57 + auVar70._4_4_ >> auVar143;
  iStack_2b0 = auVar80._8_4_ + iVar57 + auVar70._8_4_ >> auVar143;
  iStack_2ac = auVar80._12_4_ + iVar57 + auVar70._12_4_ >> auVar143;
  uVar54 = 0x20;
  do {
    uVar55 = uVar54 ^ 0xf;
    iVar104 = local_428[uVar55 * 4] + *puVar51;
    iVar108 = local_428[uVar55 * 4 + 1] + puVar51[1];
    iVar117 = local_428[uVar55 * 4 + 2] + puVar51[2];
    iVar119 = local_428[uVar55 * 4 + 3] + puVar51[3];
    iVar58 = *puVar51 - local_428[uVar55 * 4];
    iVar60 = puVar51[1] - local_428[uVar55 * 4 + 1];
    iVar61 = puVar51[2] - local_428[uVar55 * 4 + 2];
    iVar62 = puVar51[3] - local_428[uVar55 * 4 + 3];
    uVar109 = (uint)(iVar104 < iVar59) * iVar59 | (uint)(iVar104 >= iVar59) * iVar104;
    uVar118 = (uint)(iVar108 < iVar59) * iVar59 | (uint)(iVar108 >= iVar59) * iVar108;
    uVar120 = (uint)(iVar117 < iVar59) * iVar59 | (uint)(iVar117 >= iVar59) * iVar117;
    uVar122 = (uint)(iVar119 < iVar59) * iVar59 | (uint)(iVar119 >= iVar59) * iVar119;
    uVar95 = (uint)(iVar58 < iVar59) * iVar59 | (uint)(iVar58 >= iVar59) * iVar58;
    uVar102 = (uint)(iVar60 < iVar59) * iVar59 | (uint)(iVar60 >= iVar59) * iVar60;
    uVar103 = (uint)(iVar61 < iVar59) * iVar59 | (uint)(iVar61 >= iVar59) * iVar61;
    uVar105 = (uint)(iVar62 < iVar59) * iVar59 | (uint)(iVar62 >= iVar59) * iVar62;
    *puVar51 = (uint)(iVar50 < (int)uVar109) * iVar50 | (iVar50 >= (int)uVar109) * uVar109;
    puVar51[1] = (uint)(iVar50 < (int)uVar118) * iVar50 | (iVar50 >= (int)uVar118) * uVar118;
    puVar51[2] = (uint)(iVar50 < (int)uVar120) * iVar50 | (iVar50 >= (int)uVar120) * uVar120;
    puVar51[3] = (uint)(iVar50 < (int)uVar122) * iVar50 | (iVar50 >= (int)uVar122) * uVar122;
    local_428[uVar55 * 4] = (uint)(iVar50 < (int)uVar95) * iVar50 | (iVar50 >= (int)uVar95) * uVar95
    ;
    local_428[uVar55 * 4 + 1] =
         (uint)(iVar50 < (int)uVar102) * iVar50 | (iVar50 >= (int)uVar102) * uVar102;
    local_428[uVar55 * 4 + 2] =
         (uint)(iVar50 < (int)uVar103) * iVar50 | (iVar50 >= (int)uVar103) * uVar103;
    local_428[uVar55 * 4 + 3] =
         (uint)(iVar50 < (int)uVar105) * iVar50 | (iVar50 >= (int)uVar105) * uVar105;
    uVar54 = uVar54 + 1;
    puVar51 = puVar51 + 4;
  } while (uVar54 != 0x28);
  uVar54 = 0x30;
  puVar51 = local_128;
  do {
    uVar55 = uVar54 ^ 0xf;
    iVar104 = *puVar51 + local_428[uVar55 * 4];
    iVar108 = puVar51[1] + local_428[uVar55 * 4 + 1];
    iVar117 = puVar51[2] + local_428[uVar55 * 4 + 2];
    iVar119 = puVar51[3] + local_428[uVar55 * 4 + 3];
    iVar58 = local_428[uVar55 * 4] - *puVar51;
    iVar60 = local_428[uVar55 * 4 + 1] - puVar51[1];
    iVar61 = local_428[uVar55 * 4 + 2] - puVar51[2];
    iVar62 = local_428[uVar55 * 4 + 3] - puVar51[3];
    uVar109 = (uint)(iVar104 < iVar59) * iVar59 | (uint)(iVar104 >= iVar59) * iVar104;
    uVar118 = (uint)(iVar108 < iVar59) * iVar59 | (uint)(iVar108 >= iVar59) * iVar108;
    uVar120 = (uint)(iVar117 < iVar59) * iVar59 | (uint)(iVar117 >= iVar59) * iVar117;
    uVar122 = (uint)(iVar119 < iVar59) * iVar59 | (uint)(iVar119 >= iVar59) * iVar119;
    uVar95 = (uint)(iVar58 < iVar59) * iVar59 | (uint)(iVar58 >= iVar59) * iVar58;
    uVar102 = (uint)(iVar60 < iVar59) * iVar59 | (uint)(iVar60 >= iVar59) * iVar60;
    uVar103 = (uint)(iVar61 < iVar59) * iVar59 | (uint)(iVar61 >= iVar59) * iVar61;
    uVar105 = (uint)(iVar62 < iVar59) * iVar59 | (uint)(iVar62 >= iVar59) * iVar62;
    local_428[uVar55 * 4] =
         (uint)(iVar50 < (int)uVar109) * iVar50 | (iVar50 >= (int)uVar109) * uVar109;
    local_428[uVar55 * 4 + 1] =
         (uint)(iVar50 < (int)uVar118) * iVar50 | (iVar50 >= (int)uVar118) * uVar118;
    local_428[uVar55 * 4 + 2] =
         (uint)(iVar50 < (int)uVar120) * iVar50 | (iVar50 >= (int)uVar120) * uVar120;
    local_428[uVar55 * 4 + 3] =
         (uint)(iVar50 < (int)uVar122) * iVar50 | (iVar50 >= (int)uVar122) * uVar122;
    *puVar51 = (uint)(iVar50 < (int)uVar95) * iVar50 | (iVar50 >= (int)uVar95) * uVar95;
    puVar51[1] = (uint)(iVar50 < (int)uVar102) * iVar50 | (iVar50 >= (int)uVar102) * uVar102;
    puVar51[2] = (uint)(iVar50 < (int)uVar103) * iVar50 | (iVar50 >= (int)uVar103) * uVar103;
    puVar51[3] = (uint)(iVar50 < (int)uVar105) * iVar50 | (iVar50 >= (int)uVar105) * uVar105;
    uVar54 = uVar54 + 1;
    puVar51 = puVar51 + 4;
  } while (uVar54 != 0x38);
  puVar51 = (uint *)&local_238;
  lVar52 = 0;
  do {
    iVar58 = *(int *)((long)local_428 + lVar52 + 4);
    iVar60 = *(int *)((long)local_428 + lVar52 + 8);
    iVar61 = *(int *)((long)local_428 + lVar52 + 0xc);
    iVar104 = *puVar51 + *(int *)((long)local_428 + lVar52);
    iVar108 = puVar51[1] + iVar58;
    iVar117 = puVar51[2] + iVar60;
    iVar119 = puVar51[3] + iVar61;
    iVar62 = *(int *)((long)local_428 + lVar52) - *puVar51;
    iVar58 = iVar58 - puVar51[1];
    iVar60 = iVar60 - puVar51[2];
    iVar61 = iVar61 - puVar51[3];
    uVar109 = (uint)(iVar104 < iVar59) * iVar59 | (uint)(iVar104 >= iVar59) * iVar104;
    uVar118 = (uint)(iVar108 < iVar59) * iVar59 | (uint)(iVar108 >= iVar59) * iVar108;
    uVar120 = (uint)(iVar117 < iVar59) * iVar59 | (uint)(iVar117 >= iVar59) * iVar117;
    uVar122 = (uint)(iVar119 < iVar59) * iVar59 | (uint)(iVar119 >= iVar59) * iVar119;
    uVar95 = (uint)(iVar62 < iVar59) * iVar59 | (uint)(iVar62 >= iVar59) * iVar62;
    uVar102 = (uint)(iVar58 < iVar59) * iVar59 | (uint)(iVar58 >= iVar59) * iVar58;
    uVar103 = (uint)(iVar60 < iVar59) * iVar59 | (uint)(iVar60 >= iVar59) * iVar60;
    uVar105 = (uint)(iVar61 < iVar59) * iVar59 | (uint)(iVar61 >= iVar59) * iVar61;
    *(uint *)((long)local_428 + lVar52) =
         (uint)(iVar50 < (int)uVar109) * iVar50 | (iVar50 >= (int)uVar109) * uVar109;
    *(uint *)((long)local_428 + lVar52 + 4) =
         (uint)(iVar50 < (int)uVar118) * iVar50 | (iVar50 >= (int)uVar118) * uVar118;
    *(uint *)((long)local_428 + lVar52 + 8) =
         (uint)(iVar50 < (int)uVar120) * iVar50 | (iVar50 >= (int)uVar120) * uVar120;
    *(uint *)((long)local_428 + lVar52 + 0xc) =
         (uint)(iVar50 < (int)uVar122) * iVar50 | (iVar50 >= (int)uVar122) * uVar122;
    *puVar51 = (uint)(iVar50 < (int)uVar95) * iVar50 | (iVar50 >= (int)uVar95) * uVar95;
    puVar51[1] = (uint)(iVar50 < (int)uVar102) * iVar50 | (iVar50 >= (int)uVar102) * uVar102;
    puVar51[2] = (uint)(iVar50 < (int)uVar103) * iVar50 | (iVar50 >= (int)uVar103) * uVar103;
    puVar51[3] = (uint)(iVar50 < (int)uVar105) * iVar50 | (iVar50 >= (int)uVar105) * uVar105;
    lVar52 = lVar52 + 0x10;
    puVar51 = puVar51 + -4;
  } while (lVar52 != 0x100);
  auVar38._4_4_ = iStack_b4;
  auVar38._0_4_ = local_b8;
  auVar38._8_4_ = iStack_b0;
  auVar38._12_4_ = iStack_ac;
  auVar19._4_4_ = iStack_1a4;
  auVar19._0_4_ = local_1a8;
  auVar19._8_4_ = iStack_1a0;
  auVar19._12_4_ = iStack_19c;
  auVar21._4_4_ = iStack_184;
  auVar21._0_4_ = local_188;
  auVar21._8_4_ = iStack_180;
  auVar21._12_4_ = iStack_17c;
  auVar73._0_4_ = local_b8 + local_1a8;
  auVar73._4_4_ = iStack_b4 + iStack_1a4;
  auVar73._8_4_ = iStack_b0 + iStack_1a0;
  auVar73._12_4_ = iStack_ac + iStack_19c;
  auVar106 = pmulld(auVar19,auVar71);
  auVar96 = pmulld(auVar38,auVar76);
  auVar36._4_4_ = iStack_c4;
  auVar36._0_4_ = local_c8;
  auVar36._8_4_ = iStack_c0;
  auVar36._12_4_ = iStack_bc;
  auVar94._0_4_ = local_c8 + local_198._0_4_;
  auVar94._4_4_ = iStack_c4 + local_198._4_4_;
  auVar94._8_4_ = iStack_c0 + local_198._8_4_;
  auVar94._12_4_ = iStack_bc + local_198._12_4_;
  auVar138 = pmulld(local_198,auVar71);
  auVar65 = pmulld(auVar36,auVar76);
  auVar34._4_4_ = iStack_d4;
  auVar34._0_4_ = local_d8;
  auVar34._8_4_ = iStack_d0;
  auVar34._12_4_ = iStack_cc;
  auVar67._0_4_ = local_d8 + local_188;
  auVar67._4_4_ = iStack_d4 + iStack_184;
  auVar67._8_4_ = iStack_d0 + iStack_180;
  auVar67._12_4_ = iStack_cc + iStack_17c;
  auVar80 = pmulld(auVar21,auVar71);
  auVar110 = pmulld(auVar34,auVar76);
  auVar23._4_4_ = iStack_174;
  auVar23._0_4_ = local_178;
  auVar23._8_4_ = iStack_170;
  auVar23._12_4_ = iStack_16c;
  auVar32._4_4_ = iStack_e4;
  auVar32._0_4_ = local_e8;
  auVar32._8_4_ = iStack_e0;
  auVar32._12_4_ = iStack_dc;
  auVar130._0_4_ = local_e8 + local_178;
  auVar130._4_4_ = iStack_e4 + iStack_174;
  auVar130._8_4_ = iStack_e0 + iStack_170;
  auVar130._12_4_ = iStack_dc + iStack_16c;
  auVar123 = pmulld(auVar23,auVar71);
  auVar70 = pmulld(auVar32,auVar76);
  auVar69 = pmulld(auVar130,auVar76);
  local_e8 = auVar69._0_4_ + iVar57 >> auVar143;
  iStack_e4 = auVar69._4_4_ + iVar57 >> auVar143;
  iStack_e0 = auVar69._8_4_ + iVar57 >> auVar143;
  iStack_dc = auVar69._12_4_ + iVar57 >> auVar143;
  auVar69 = pmulld(auVar67,auVar76);
  auVar86 = pmulld(auVar94,auVar76);
  local_d8 = auVar69._0_4_ + iVar57 >> auVar143;
  iStack_d4 = auVar69._4_4_ + iVar57 >> auVar143;
  iStack_d0 = auVar69._8_4_ + iVar57 >> auVar143;
  iStack_cc = auVar69._12_4_ + iVar57 >> auVar143;
  local_c8 = auVar86._0_4_ + iVar57 >> auVar143;
  iStack_c4 = auVar86._4_4_ + iVar57 >> auVar143;
  iStack_c0 = auVar86._8_4_ + iVar57 >> auVar143;
  iStack_bc = auVar86._12_4_ + iVar57 >> auVar143;
  auVar69 = pmulld(auVar73,auVar76);
  local_b8 = auVar69._0_4_ + iVar57 >> auVar143;
  iStack_b4 = auVar69._4_4_ + iVar57 >> auVar143;
  iStack_b0 = auVar69._8_4_ + iVar57 >> auVar143;
  iStack_ac = auVar69._12_4_ + iVar57 >> auVar143;
  local_1a8 = auVar106._0_4_ + iVar57 + auVar96._0_4_ >> auVar143;
  iStack_1a4 = auVar106._4_4_ + iVar57 + auVar96._4_4_ >> auVar143;
  iStack_1a0 = auVar106._8_4_ + iVar57 + auVar96._8_4_ >> auVar143;
  iStack_19c = auVar106._12_4_ + iVar57 + auVar96._12_4_ >> auVar143;
  local_198._4_4_ = auVar138._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  local_198._0_4_ = auVar138._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  local_198._8_4_ = auVar138._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  local_198._12_4_ = auVar138._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_188 = auVar80._0_4_ + iVar57 + auVar110._0_4_ >> auVar143;
  iStack_184 = auVar80._4_4_ + iVar57 + auVar110._4_4_ >> auVar143;
  iStack_180 = auVar80._8_4_ + iVar57 + auVar110._8_4_ >> auVar143;
  iStack_17c = auVar80._12_4_ + iVar57 + auVar110._12_4_ >> auVar143;
  local_178 = auVar123._0_4_ + iVar57 + auVar70._0_4_ >> auVar143;
  iStack_174 = auVar123._4_4_ + iVar57 + auVar70._4_4_ >> auVar143;
  iStack_170 = auVar123._8_4_ + iVar57 + auVar70._8_4_ >> auVar143;
  iStack_16c = auVar123._12_4_ + iVar57 + auVar70._12_4_ >> auVar143;
  auVar24._4_4_ = iStack_164;
  auVar24._0_4_ = local_168;
  auVar24._8_4_ = iStack_160;
  auVar24._12_4_ = iStack_15c;
  auVar30._4_4_ = iStack_f4;
  auVar30._0_4_ = local_f8;
  auVar30._8_4_ = iStack_f0;
  auVar30._12_4_ = iStack_ec;
  auVar74._0_4_ = local_f8 + local_168;
  auVar74._4_4_ = iStack_f4 + iStack_164;
  auVar74._8_4_ = iStack_f0 + iStack_160;
  auVar74._12_4_ = iStack_ec + iStack_15c;
  auVar80 = pmulld(auVar24,auVar71);
  auVar138 = pmulld(auVar30,auVar76);
  auVar25._4_4_ = iStack_154;
  auVar25._0_4_ = local_158;
  auVar25._8_4_ = iStack_150;
  auVar25._12_4_ = iStack_14c;
  auVar29._4_4_ = iStack_104;
  auVar29._0_4_ = local_108;
  auVar29._8_4_ = iStack_100;
  auVar29._12_4_ = iStack_fc;
  auVar116._0_4_ = local_108 + local_158;
  auVar116._4_4_ = iStack_104 + iStack_154;
  auVar116._8_4_ = iStack_100 + iStack_150;
  auVar116._12_4_ = iStack_fc + iStack_14c;
  auVar106 = pmulld(auVar25,auVar71);
  auVar65 = pmulld(auVar29,auVar76);
  auVar28._4_4_ = local_128[5];
  auVar28._0_4_ = local_128[4];
  auVar28._8_4_ = local_128[6];
  auVar28._12_4_ = iStack_10c;
  auVar68._0_4_ = local_128[4] + local_148._0_4_;
  auVar68._4_4_ = local_128[5] + local_148._4_4_;
  auVar68._8_4_ = local_128[6] + local_148._8_4_;
  auVar68._12_4_ = iStack_10c + local_148._12_4_;
  auVar86 = pmulld(local_148,auVar71);
  auVar110 = pmulld(auVar28,auVar76);
  auVar26._4_4_ = iStack_134;
  auVar26._0_4_ = local_138;
  auVar26._8_4_ = iStack_130;
  auVar26._12_4_ = iStack_12c;
  auVar27._4_4_ = local_128[1];
  auVar27._0_4_ = local_128[0];
  auVar27._8_4_ = local_128[2];
  auVar27._12_4_ = local_128[3];
  auVar70 = pmulld(auVar71,auVar26);
  auVar123 = pmulld(auVar27,auVar76);
  auVar131._0_4_ = local_128[0] + local_138;
  auVar131._4_4_ = local_128[1] + iStack_134;
  auVar131._8_4_ = local_128[2] + iStack_130;
  auVar131._12_4_ = local_128[3] + iStack_12c;
  auVar69 = pmulld(auVar131,auVar76);
  local_128[0] = auVar69._0_4_ + iVar57 >> auVar143;
  local_128[1] = auVar69._4_4_ + iVar57 >> auVar143;
  local_128[2] = auVar69._8_4_ + iVar57 >> auVar143;
  local_128[3] = auVar69._12_4_ + iVar57 >> auVar143;
  auVar69 = pmulld(auVar68,auVar76);
  local_128[4] = auVar69._0_4_ + iVar57 >> auVar143;
  local_128[5] = auVar69._4_4_ + iVar57 >> auVar143;
  local_128[6] = auVar69._8_4_ + iVar57 >> auVar143;
  iStack_10c = auVar69._12_4_ + iVar57 >> auVar143;
  auVar96 = pmulld(auVar116,auVar76);
  auVar69 = pmulld(auVar74,auVar76);
  local_108 = auVar96._0_4_ + iVar57 >> auVar143;
  iStack_104 = auVar96._4_4_ + iVar57 >> auVar143;
  iStack_100 = auVar96._8_4_ + iVar57 >> auVar143;
  iStack_fc = auVar96._12_4_ + iVar57 >> auVar143;
  local_f8 = auVar69._0_4_ + iVar57 >> auVar143;
  iStack_f4 = auVar69._4_4_ + iVar57 >> auVar143;
  iStack_f0 = auVar69._8_4_ + iVar57 >> auVar143;
  iStack_ec = auVar69._12_4_ + iVar57 >> auVar143;
  local_168 = auVar80._0_4_ + iVar57 + auVar138._0_4_ >> auVar143;
  iStack_164 = auVar80._4_4_ + iVar57 + auVar138._4_4_ >> auVar143;
  iStack_160 = auVar80._8_4_ + iVar57 + auVar138._8_4_ >> auVar143;
  iStack_15c = auVar80._12_4_ + iVar57 + auVar138._12_4_ >> auVar143;
  local_158 = auVar106._0_4_ + iVar57 + auVar65._0_4_ >> auVar143;
  iStack_154 = auVar106._4_4_ + iVar57 + auVar65._4_4_ >> auVar143;
  iStack_150 = auVar106._8_4_ + iVar57 + auVar65._8_4_ >> auVar143;
  iStack_14c = auVar106._12_4_ + iVar57 + auVar65._12_4_ >> auVar143;
  local_148._4_4_ = auVar86._4_4_ + iVar57 + auVar110._4_4_ >> auVar143;
  local_148._0_4_ = auVar86._0_4_ + iVar57 + auVar110._0_4_ >> auVar143;
  local_148._8_4_ = auVar86._8_4_ + iVar57 + auVar110._8_4_ >> auVar143;
  local_148._12_4_ = auVar86._12_4_ + iVar57 + auVar110._12_4_ >> auVar143;
  local_138 = auVar70._0_4_ + iVar57 + auVar123._0_4_ >> auVar143;
  iStack_134 = auVar70._4_4_ + iVar57 + auVar123._4_4_ >> auVar143;
  iStack_130 = auVar70._8_4_ + iVar57 + auVar123._8_4_ >> auVar143;
  iStack_12c = auVar70._12_4_ + iVar57 + auVar123._12_4_ >> auVar143;
  lVar52 = 0x3f0;
  lVar53 = 0;
  do {
    iVar57 = *(int *)((long)local_428 + lVar53 + 4);
    iVar58 = *(int *)((long)local_428 + lVar53 + 8);
    iVar60 = *(int *)((long)local_428 + lVar53 + 0xc);
    iVar61 = *(int *)((long)local_428 + lVar52 + 4);
    iVar62 = *(int *)((long)local_428 + lVar52 + 8);
    iVar104 = *(int *)((long)local_428 + lVar52 + 0xc);
    iVar117 = *(int *)((long)local_428 + lVar52) + *(int *)((long)local_428 + lVar53);
    iVar119 = iVar61 + iVar57;
    iVar121 = iVar62 + iVar58;
    iVar75 = iVar104 + iVar60;
    iVar108 = *(int *)((long)local_428 + lVar53) - *(int *)((long)local_428 + lVar52);
    iVar57 = iVar57 - iVar61;
    iVar58 = iVar58 - iVar62;
    iVar60 = iVar60 - iVar104;
    uVar109 = (uint)(iVar117 < iVar59) * iVar59 | (uint)(iVar117 >= iVar59) * iVar117;
    uVar118 = (uint)(iVar119 < iVar59) * iVar59 | (uint)(iVar119 >= iVar59) * iVar119;
    uVar120 = (uint)(iVar121 < iVar59) * iVar59 | (uint)(iVar121 >= iVar59) * iVar121;
    uVar122 = (uint)(iVar75 < iVar59) * iVar59 | (uint)(iVar75 >= iVar59) * iVar75;
    uVar95 = (uint)(iVar108 < iVar59) * iVar59 | (uint)(iVar108 >= iVar59) * iVar108;
    uVar102 = (uint)(iVar57 < iVar59) * iVar59 | (uint)(iVar57 >= iVar59) * iVar57;
    uVar103 = (uint)(iVar58 < iVar59) * iVar59 | (uint)(iVar58 >= iVar59) * iVar58;
    uVar105 = (uint)(iVar60 < iVar59) * iVar59 | (uint)(iVar60 >= iVar59) * iVar60;
    puVar51 = (uint *)((long)*out + lVar53);
    *puVar51 = (uint)(iVar50 < (int)uVar109) * iVar50 | (iVar50 >= (int)uVar109) * uVar109;
    puVar51[1] = (uint)(iVar50 < (int)uVar118) * iVar50 | (iVar50 >= (int)uVar118) * uVar118;
    puVar51[2] = (uint)(iVar50 < (int)uVar120) * iVar50 | (iVar50 >= (int)uVar120) * uVar120;
    puVar51[3] = (uint)(iVar50 < (int)uVar122) * iVar50 | (iVar50 >= (int)uVar122) * uVar122;
    puVar51 = (uint *)((long)*out + lVar52);
    *puVar51 = (uint)(iVar50 < (int)uVar95) * iVar50 | (iVar50 >= (int)uVar95) * uVar95;
    puVar51[1] = (uint)(iVar50 < (int)uVar102) * iVar50 | (iVar50 >= (int)uVar102) * uVar102;
    puVar51[2] = (uint)(iVar50 < (int)uVar103) * iVar50 | (iVar50 >= (int)uVar103) * uVar103;
    puVar51[3] = (uint)(iVar50 < (int)uVar105) * iVar50 | (iVar50 >= (int)uVar105) * uVar105;
    lVar52 = lVar52 + -0x10;
    lVar53 = lVar53 + 0x10;
  } while (lVar52 != 0x1f0);
  if (do_cols == 0) {
    iVar50 = 10;
    if (10 < bd) {
      iVar50 = bd;
    }
    local_448 = 0x20 << ((byte)iVar50 & 0x1f);
    local_438 = -local_448;
    local_448 = local_448 + -1;
    iVar50 = 1 << ((char)out_shift - 1U & 0x1f);
    uVar54 = 0xfffffffffffffffc;
    auVar143 = ZEXT416((uint)out_shift);
    iStack_444 = local_448;
    iStack_440 = local_448;
    iStack_43c = local_448;
    iStack_434 = local_438;
    iStack_430 = local_438;
    iStack_42c = local_438;
    do {
      if (out_shift != 0) {
        iVar57 = *(int *)((long)*out + 4);
        lVar43 = (*out)[1];
        iVar58 = *(int *)((long)*out + 0xc);
        lVar44 = out[1][0];
        iVar59 = *(int *)((long)out[1] + 4);
        lVar45 = out[1][1];
        iVar60 = *(int *)((long)out[1] + 0xc);
        lVar46 = out[2][0];
        iVar61 = *(int *)((long)out[2] + 4);
        lVar47 = out[2][1];
        iVar62 = *(int *)((long)out[2] + 0xc);
        lVar48 = out[3][0];
        iVar104 = *(int *)((long)out[3] + 4);
        lVar49 = out[3][1];
        iVar108 = *(int *)((long)out[3] + 0xc);
        *(int *)*out = (int)(*out)[0] + iVar50 >> auVar143;
        *(int *)((long)*out + 4) = iVar57 + iVar50 >> auVar143;
        *(int *)(*out + 1) = (int)lVar43 + iVar50 >> auVar143;
        *(int *)((long)*out + 0xc) = iVar58 + iVar50 >> auVar143;
        *(int *)out[1] = (int)lVar44 + iVar50 >> auVar143;
        *(int *)((long)out[1] + 4) = iVar59 + iVar50 >> auVar143;
        *(int *)(out[1] + 1) = (int)lVar45 + iVar50 >> auVar143;
        *(int *)((long)out[1] + 0xc) = iVar60 + iVar50 >> auVar143;
        *(int *)out[2] = (int)lVar46 + iVar50 >> auVar143;
        *(int *)((long)out[2] + 4) = iVar61 + iVar50 >> auVar143;
        *(int *)(out[2] + 1) = (int)lVar47 + iVar50 >> auVar143;
        *(int *)((long)out[2] + 0xc) = iVar62 + iVar50 >> auVar143;
        *(int *)out[3] = (int)lVar48 + iVar50 >> auVar143;
        *(int *)((long)out[3] + 4) = iVar104 + iVar50 >> auVar143;
        *(int *)(out[3] + 1) = (int)lVar49 + iVar50 >> auVar143;
        *(int *)((long)out[3] + 0xc) = iVar108 + iVar50 >> auVar143;
      }
      highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_438,(__m128i *)&local_448,4);
      uVar54 = uVar54 + 4;
      out = out + 4;
    } while (uVar54 < 0x3c);
  }
  return;
}

Assistant:

static void idct64x64_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

  const __m128i cospi1 = _mm_set1_epi32(cospi[1]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi3 = _mm_set1_epi32(cospi[3]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim12 = _mm_set1_epi32(-cospi[12]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim28 = _mm_set1_epi32(-cospi[28]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospi63 = _mm_set1_epi32(cospi[63]);
  const __m128i cospim57 = _mm_set1_epi32(-cospi[57]);
  const __m128i cospi7 = _mm_set1_epi32(cospi[7]);
  const __m128i cospi5 = _mm_set1_epi32(cospi[5]);
  const __m128i cospi59 = _mm_set1_epi32(cospi[59]);
  const __m128i cospim61 = _mm_set1_epi32(-cospi[61]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);

  {
    __m128i u[64];

    // stage 1
    u[0] = in[0];
    u[8] = in[4];
    u[16] = in[2];
    u[24] = in[6];
    u[32] = in[1];
    u[40] = in[5];
    u[48] = in[3];
    u[56] = in[7];

    // stage 2
    u[63] = half_btf_0_sse4_1(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_sse4_1(&cospi63, &u[32], &rnding, bit);
    u[39] = half_btf_0_sse4_1(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_sse4_1(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_sse4_1(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_sse4_1(&cospi59, &u[40], &rnding, bit);
    u[47] = half_btf_0_sse4_1(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_sse4_1(&cospi3, &u[48], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_sse4_1(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_sse4_1(&cospi62, &u[16], &rnding, bit);
    u[23] = half_btf_0_sse4_1(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_sse4_1(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[38] = u[39];
    u[41] = u[40];
    u[46] = u[47];
    u[49] = u[48];
    u[54] = u[55];
    u[57] = u[56];
    u[62] = u[63];

    // stage 4
    __m128i temp1, temp2;
    u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);
    u[17] = u[16];
    u[22] = u[23];
    u[25] = u[24];
    u[30] = u[31];

    temp1 = half_btf_sse4_1(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    u[62] = half_btf_sse4_1(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = temp1;

    temp2 = half_btf_sse4_1(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[38] = half_btf_sse4_1(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = temp2;

    temp1 = half_btf_sse4_1(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    u[54] = half_btf_sse4_1(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = temp1;

    temp2 = half_btf_sse4_1(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_sse4_1(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[46] = temp2;

    // stage 5
    u[9] = u[8];
    u[14] = u[15];

    temp1 = half_btf_sse4_1(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    u[30] = half_btf_sse4_1(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = temp1;

    temp2 = half_btf_sse4_1(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_sse4_1(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[22] = temp2;

    u[35] = u[32];
    u[34] = u[33];
    u[36] = u[39];
    u[37] = u[38];
    u[43] = u[40];
    u[42] = u[41];
    u[44] = u[47];
    u[45] = u[46];
    u[51] = u[48];
    u[50] = u[49];
    u[52] = u[55];
    u[53] = u[54];
    u[59] = u[56];
    u[58] = u[57];
    u[60] = u[63];
    u[61] = u[62];

    // stage 6
    temp1 = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[0] = temp1;

    temp2 = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = temp2;
    u[19] = u[16];
    u[18] = u[17];
    u[20] = u[23];
    u[21] = u[22];
    u[27] = u[24];
    u[26] = u[25];
    u[28] = u[31];
    u[29] = u[30];

    temp1 = half_btf_sse4_1(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = temp1;
    temp2 = half_btf_sse4_1(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    u[60] = half_btf_sse4_1(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[35] = temp2;
    temp1 = half_btf_sse4_1(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    u[59] = half_btf_sse4_1(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[36] = temp1;
    temp2 = half_btf_sse4_1(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[37] = temp2;
    temp1 = half_btf_sse4_1(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = temp1;
    temp2 = half_btf_sse4_1(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    u[52] = half_btf_sse4_1(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[43] = temp2;
    temp1 = half_btf_sse4_1(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    u[51] = half_btf_sse4_1(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[44] = temp1;
    temp2 = half_btf_sse4_1(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[45] = temp2;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    u[11] = u[8];
    u[10] = u[9];
    u[12] = u[15];
    u[13] = u[14];

    temp1 = half_btf_sse4_1(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = temp1;
    temp2 = half_btf_sse4_1(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    u[28] = half_btf_sse4_1(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[19] = temp2;
    temp1 = half_btf_sse4_1(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    u[27] = half_btf_sse4_1(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[20] = temp1;
    temp2 = half_btf_sse4_1(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[21] = temp2;
    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_sse4_1(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_sse4_1(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                      &clamp_hi);
      }
    }

    // stage 8
    u[7] = u[0];
    u[6] = u[1];
    u[5] = u[2];
    u[4] = u[3];

    idct64_stage8_sse4_1(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                         &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                         bit);

    // stage 10
    idct64_stage10_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                          bit);

    // stage 11
    idct64_stage11_sse4_1(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}